

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::LayerNorm_x86_avx512::forward_inplace
          (LayerNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  int iVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  int iVar36;
  undefined1 (*pauVar37) [64];
  int iVar38;
  uint uVar39;
  uint uVar40;
  undefined1 (*pauVar41) [64];
  ulong uVar42;
  undefined1 (*pauVar43) [64];
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  uint uVar47;
  ulong uVar48;
  undefined1 (*pauVar49) [64];
  undefined1 (*pauVar50) [64];
  uint uVar51;
  long lVar52;
  ushort uVar53;
  undefined1 auVar59 [32];
  undefined1 auVar56 [16];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar54 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar55 [16];
  undefined1 auVar73 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar119 [48];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar78 [64];
  undefined1 auVar80 [64];
  undefined1 auVar61 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar63 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  float _mean;
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  float fVar123;
  float fVar127;
  __m128 _b_128;
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float _a;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float _b;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar173 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar174 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar77 [64];
  undefined1 auVar79 [64];
  undefined1 auVar81 [64];
  undefined1 auVar89 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar106 [64];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  
  auVar122 = _DAT_0055ce40;
  iVar36 = bottom_top_blob->elempack;
  iVar38 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  pp_Var5 = this->_vptr_LayerNorm_x86_avx512;
  p_Var6 = pp_Var5[-3];
  pauVar43 = *(undefined1 (**) [64])(&this->field_0xe0 + (long)p_Var6);
  pauVar50 = *(undefined1 (**) [64])(&this->field_0x128 + (long)p_Var6);
  if (iVar38 == 1) {
    uVar45 = iVar4 * iVar36;
    pauVar49 = (undefined1 (*) [64])bottom_top_blob->data;
    pauVar37 = pauVar49;
    if ((int)uVar45 < 0x10) {
      uVar44 = 0;
      auVar122 = ZEXT864(0);
    }
    else {
      uVar44 = uVar45 & 0x7ffffff0;
      auVar122 = ZEXT864(0);
      iVar36 = 0x10;
      do {
        auVar122 = vaddps_avx512f(auVar122,*pauVar37);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar45);
    }
    fVar120 = 0.0;
    fVar128 = 0.0;
    fVar123 = 0.0;
    fVar127 = 0.0;
    fVar129 = 0.0;
    fVar130 = 0.0;
    fVar131 = 0.0;
    fVar132 = 0.0;
    uVar47 = uVar44 | 8;
    while ((int)uVar47 <= (int)uVar45) {
      fVar123 = fVar123 + *(float *)*pauVar37;
      fVar127 = fVar127 + *(float *)(*pauVar37 + 4);
      fVar120 = fVar120 + *(float *)(*pauVar37 + 8);
      fVar128 = fVar128 + *(float *)(*pauVar37 + 0xc);
      fVar129 = fVar129 + *(float *)(*pauVar37 + 0x10);
      fVar130 = fVar130 + *(float *)(*pauVar37 + 0x14);
      fVar131 = fVar131 + *(float *)(*pauVar37 + 0x18);
      fVar132 = fVar132 + *(float *)(*pauVar37 + 0x1c);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar47 = uVar44 + 0x10;
      uVar44 = uVar44 + 8;
    }
    iVar36 = uVar44 + 4;
    auVar54 = ZEXT816(0) << 0x40;
    while (iVar36 <= (int)uVar45) {
      auVar55._0_4_ = auVar54._0_4_ + *(float *)*pauVar37;
      auVar55._4_4_ = auVar54._4_4_ + *(float *)(*pauVar37 + 4);
      auVar55._8_4_ = auVar54._8_4_ + *(float *)(*pauVar37 + 8);
      auVar55._12_4_ = auVar54._12_4_ + *(float *)(*pauVar37 + 0xc);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar44 + 8;
      auVar54 = auVar55;
      uVar44 = uVar44 + 4;
    }
    fVar135 = 0.0;
    if ((int)uVar44 < (int)uVar45) {
      auVar67 = vpbroadcastq_avx512f();
      uVar48 = 0;
      auVar68 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar71 = auVar66;
        auVar66 = vpbroadcastq_avx512f();
        auVar70 = vporq_avx512f(auVar66,auVar68);
        auVar66 = vporq_avx512f(auVar66,auVar69);
        uVar20 = vpcmpuq_avx512f(auVar66,auVar67,2);
        bVar30 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar70,auVar67,2);
        bVar31 = (byte)uVar20;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar48 * 4);
        auVar66._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar66._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar66._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar66._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar66._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar66._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar66._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar66._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar66._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar66._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar66._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar66._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar66._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar66._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar66._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar66._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar66 = vaddps_avx512f(auVar66,auVar71);
        uVar48 = uVar48 + 0x10;
      } while (((ulong)(~uVar44 + uVar45) + 0x10 & 0x1fffffff0) != uVar48);
      auVar67._0_4_ = (uint)(bVar30 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar71._0_4_
      ;
      bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar67._4_4_ = (uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar71._4_4_;
      bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar67._8_4_ = (uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar71._8_4_;
      bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar67._12_4_ = (uint)bVar7 * auVar66._12_4_ | (uint)!bVar7 * auVar71._12_4_;
      bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar67._16_4_ = (uint)bVar7 * auVar66._16_4_ | (uint)!bVar7 * auVar71._16_4_;
      bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar67._20_4_ = (uint)bVar7 * auVar66._20_4_ | (uint)!bVar7 * auVar71._20_4_;
      bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar67._24_4_ = (uint)bVar7 * auVar66._24_4_ | (uint)!bVar7 * auVar71._24_4_;
      bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar67._28_4_ = (uint)bVar7 * auVar66._28_4_ | (uint)!bVar7 * auVar71._28_4_;
      auVar67._32_4_ =
           (uint)(bVar31 & 1) * auVar66._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar71._32_4_;
      bVar7 = (bool)(bVar31 >> 1 & 1);
      auVar67._36_4_ = (uint)bVar7 * auVar66._36_4_ | (uint)!bVar7 * auVar71._36_4_;
      bVar7 = (bool)(bVar31 >> 2 & 1);
      auVar67._40_4_ = (uint)bVar7 * auVar66._40_4_ | (uint)!bVar7 * auVar71._40_4_;
      bVar7 = (bool)(bVar31 >> 3 & 1);
      auVar67._44_4_ = (uint)bVar7 * auVar66._44_4_ | (uint)!bVar7 * auVar71._44_4_;
      bVar7 = (bool)(bVar31 >> 4 & 1);
      auVar67._48_4_ = (uint)bVar7 * auVar66._48_4_ | (uint)!bVar7 * auVar71._48_4_;
      bVar7 = (bool)(bVar31 >> 5 & 1);
      auVar67._52_4_ = (uint)bVar7 * auVar66._52_4_ | (uint)!bVar7 * auVar71._52_4_;
      bVar7 = (bool)(bVar31 >> 6 & 1);
      auVar67._56_4_ = (uint)bVar7 * auVar66._56_4_ | (uint)!bVar7 * auVar71._56_4_;
      auVar67._60_4_ =
           (uint)(bVar31 >> 7) * auVar66._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar71._60_4_;
      auVar65 = vextractf64x4_avx512f(auVar67,1);
      auVar66 = vaddps_avx512f(auVar67,ZEXT3264(auVar65));
      auVar57._0_4_ = auVar66._0_4_ + auVar66._16_4_;
      auVar57._4_4_ = auVar66._4_4_ + auVar66._20_4_;
      auVar57._8_4_ = auVar66._8_4_ + auVar66._24_4_;
      auVar57._12_4_ = auVar66._12_4_ + auVar66._28_4_;
      auVar55 = vshufpd_avx(auVar57,auVar57,1);
      auVar56._0_4_ = auVar57._0_4_ + auVar55._0_4_;
      auVar56._4_4_ = auVar57._4_4_ + auVar55._4_4_;
      auVar56._8_4_ = auVar57._8_4_ + auVar55._8_4_;
      auVar56._12_4_ = auVar57._12_4_ + auVar55._12_4_;
      auVar55 = vhaddps_avx(auVar56,auVar56);
      fVar135 = auVar55._0_4_;
    }
    auVar65 = vextractf64x4_avx512f(auVar122,1);
    auVar122 = vaddps_avx512f(auVar122,ZEXT3264(auVar65));
    auVar58._0_4_ = auVar122._0_4_ + auVar122._16_4_;
    auVar58._4_4_ = auVar122._4_4_ + auVar122._20_4_;
    auVar58._8_4_ = auVar122._8_4_ + auVar122._24_4_;
    auVar58._12_4_ = auVar122._12_4_ + auVar122._28_4_;
    auVar55 = vshufpd_avx(auVar58,auVar58,1);
    auVar121._0_4_ = auVar58._0_4_ + auVar55._0_4_;
    auVar121._4_4_ = auVar58._4_4_ + auVar55._4_4_;
    auVar121._8_4_ = auVar58._8_4_ + auVar55._8_4_;
    auVar121._12_4_ = auVar58._12_4_ + auVar55._12_4_;
    auVar55 = vhaddps_avx(auVar121,auVar121);
    auVar124._0_4_ = fVar129 + fVar123;
    auVar124._4_4_ = fVar130 + fVar127;
    auVar124._8_4_ = fVar131 + fVar120;
    auVar124._12_4_ = fVar132 + fVar128;
    auVar57 = vshufps_avx(auVar54,auVar124,0x41);
    auVar54 = vshufps_avx(auVar54,auVar124,0xeb);
    auVar125._0_4_ = auVar54._0_4_ + auVar57._0_4_;
    auVar125._4_4_ = auVar54._4_4_ + auVar57._4_4_;
    auVar125._8_4_ = auVar54._8_4_ + auVar57._8_4_;
    auVar125._12_4_ = auVar54._12_4_ + auVar57._12_4_;
    auVar54 = vshufpd_avx(auVar125,auVar125,1);
    auVar126._0_4_ = auVar125._0_4_ + auVar54._0_4_;
    auVar126._4_4_ = auVar125._4_4_ + auVar54._4_4_;
    auVar126._8_4_ = auVar125._8_4_ + auVar54._8_4_;
    auVar126._12_4_ = auVar125._12_4_ + auVar54._12_4_;
    auVar54 = vhaddps_avx(auVar126,auVar126);
    auVar54._0_4_ = (fVar135 + auVar55._0_4_ + auVar54._0_4_) / (float)(int)uVar45;
    auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar122 = vbroadcastss_avx512f(auVar54);
    pauVar37 = pauVar49;
    if ((int)uVar45 < 0x10) {
      uVar44 = 0;
      auVar66 = ZEXT864(0) << 0x20;
    }
    else {
      uVar44 = uVar45 & 0x7ffffff0;
      auVar66 = ZEXT864(0) << 0x40;
      iVar36 = 0x10;
      do {
        auVar67 = vsubps_avx512f(*pauVar37,auVar122);
        auVar66 = vfmadd231ps_avx512f(auVar66,auVar67,auVar67);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar45);
    }
    auVar55 = ZEXT816(0) << 0x40;
    uVar47 = uVar44 | 8;
    while ((int)uVar47 <= (int)uVar45) {
      auVar65 = vsubps_avx(*(undefined1 (*) [32])*pauVar37,auVar122._0_32_);
      auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar65,auVar65);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar47 = uVar44 + 0x10;
      uVar44 = uVar44 + 8;
    }
    auVar57 = ZEXT816(0) << 0x40;
    iVar36 = uVar44 + 4;
    while (iVar36 <= (int)uVar45) {
      auVar56 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar122._0_16_);
      auVar57 = vfmadd231ps_fma(auVar57,auVar56,auVar56);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar44 + 8;
      uVar44 = uVar44 + 4;
    }
    fVar120 = 0.0;
    if ((int)uVar44 < (int)uVar45) {
      auVar68 = vpbroadcastq_avx512f();
      uVar48 = 0;
      auVar69 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar173 = auVar67;
        auVar67 = vpbroadcastq_avx512f();
        auVar71 = vporq_avx512f(auVar67,auVar69);
        auVar67 = vporq_avx512f(auVar67,auVar70);
        uVar20 = vpcmpuq_avx512f(auVar67,auVar68,2);
        bVar30 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar71,auVar68,2);
        bVar31 = (byte)uVar20;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar48 * 4);
        auVar71._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar71._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar71._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar71._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar71._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar71._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar71._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar71._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar71._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar71._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar71._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar71._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar71._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar71._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar71._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar71._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar67 = vsubps_avx512f(auVar71,auVar122);
        auVar67 = vfmadd213ps_avx512f(auVar67,auVar67,auVar173);
        uVar48 = uVar48 + 0x10;
      } while (((ulong)(~uVar44 + uVar45) + 0x10 & 0x1fffffff0) != uVar48);
      auVar122._0_4_ =
           (uint)(bVar30 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar173._0_4_;
      bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * auVar173._4_4_;
      bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar7 * auVar67._8_4_ | (uint)!bVar7 * auVar173._8_4_;
      bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar7 * auVar67._12_4_ | (uint)!bVar7 * auVar173._12_4_;
      bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar7 * auVar67._16_4_ | (uint)!bVar7 * auVar173._16_4_;
      bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar7 * auVar67._20_4_ | (uint)!bVar7 * auVar173._20_4_;
      bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar7 * auVar67._24_4_ | (uint)!bVar7 * auVar173._24_4_;
      bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar122._28_4_ = (uint)bVar7 * auVar67._28_4_ | (uint)!bVar7 * auVar173._28_4_;
      auVar122._32_4_ =
           (uint)(bVar31 & 1) * auVar67._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar173._32_4_;
      bVar7 = (bool)(bVar31 >> 1 & 1);
      auVar122._36_4_ = (uint)bVar7 * auVar67._36_4_ | (uint)!bVar7 * auVar173._36_4_;
      bVar7 = (bool)(bVar31 >> 2 & 1);
      auVar122._40_4_ = (uint)bVar7 * auVar67._40_4_ | (uint)!bVar7 * auVar173._40_4_;
      bVar7 = (bool)(bVar31 >> 3 & 1);
      auVar122._44_4_ = (uint)bVar7 * auVar67._44_4_ | (uint)!bVar7 * auVar173._44_4_;
      bVar7 = (bool)(bVar31 >> 4 & 1);
      auVar122._48_4_ = (uint)bVar7 * auVar67._48_4_ | (uint)!bVar7 * auVar173._48_4_;
      bVar7 = (bool)(bVar31 >> 5 & 1);
      auVar122._52_4_ = (uint)bVar7 * auVar67._52_4_ | (uint)!bVar7 * auVar173._52_4_;
      bVar7 = (bool)(bVar31 >> 6 & 1);
      auVar122._56_4_ = (uint)bVar7 * auVar67._56_4_ | (uint)!bVar7 * auVar173._56_4_;
      auVar122._60_4_ =
           (uint)(bVar31 >> 7) * auVar67._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar173._60_4_;
      auVar65 = vextractf64x4_avx512f(auVar122,1);
      auVar122 = vaddps_avx512f(auVar122,ZEXT3264(auVar65));
      auVar136._0_4_ = auVar122._0_4_ + auVar122._16_4_;
      auVar136._4_4_ = auVar122._4_4_ + auVar122._20_4_;
      auVar136._8_4_ = auVar122._8_4_ + auVar122._24_4_;
      auVar136._12_4_ = auVar122._12_4_ + auVar122._28_4_;
      auVar56 = vshufpd_avx(auVar136,auVar136,1);
      auVar137._0_4_ = auVar136._0_4_ + auVar56._0_4_;
      auVar137._4_4_ = auVar136._4_4_ + auVar56._4_4_;
      auVar137._8_4_ = auVar136._8_4_ + auVar56._8_4_;
      auVar137._12_4_ = auVar136._12_4_ + auVar56._12_4_;
      auVar56 = vhaddps_avx(auVar137,auVar137);
      fVar120 = auVar56._0_4_;
    }
    auVar65 = vextractf64x4_avx512f(auVar66,1);
    auVar122 = vaddps_avx512f(auVar66,ZEXT3264(auVar65));
    auVar133._0_4_ = auVar122._0_4_ + auVar122._16_4_;
    auVar133._4_4_ = auVar122._4_4_ + auVar122._20_4_;
    auVar133._8_4_ = auVar122._8_4_ + auVar122._24_4_;
    auVar133._12_4_ = auVar122._12_4_ + auVar122._28_4_;
    auVar56 = vshufpd_avx(auVar133,auVar133,1);
    auVar134._0_4_ = auVar133._0_4_ + auVar56._0_4_;
    auVar134._4_4_ = auVar133._4_4_ + auVar56._4_4_;
    auVar134._8_4_ = auVar133._8_4_ + auVar56._8_4_;
    auVar134._12_4_ = auVar133._12_4_ + auVar56._12_4_;
    auVar56 = vhaddps_avx(auVar134,auVar134);
    auVar138._0_4_ = auVar55._0_4_ + 0.0;
    auVar138._4_4_ = auVar55._4_4_ + 0.0;
    auVar138._8_4_ = auVar55._8_4_ + 0.0;
    auVar138._12_4_ = auVar55._12_4_ + 0.0;
    auVar55 = vshufps_avx(auVar57,auVar138,0x41);
    auVar57 = vshufps_avx(auVar57,auVar138,0xeb);
    auVar139._0_4_ = auVar57._0_4_ + auVar55._0_4_;
    auVar139._4_4_ = auVar57._4_4_ + auVar55._4_4_;
    auVar139._8_4_ = auVar57._8_4_ + auVar55._8_4_;
    auVar139._12_4_ = auVar57._12_4_ + auVar55._12_4_;
    auVar55 = vshufpd_avx(auVar139,auVar139,1);
    auVar140._0_4_ = auVar139._0_4_ + auVar55._0_4_;
    auVar140._4_4_ = auVar139._4_4_ + auVar55._4_4_;
    auVar140._8_4_ = auVar139._8_4_ + auVar55._8_4_;
    auVar140._12_4_ = auVar139._12_4_ + auVar55._12_4_;
    auVar55 = vhaddps_avx(auVar140,auVar140);
    fVar120 = (fVar120 + auVar56._0_4_ + auVar55._0_4_) / (float)(int)uVar45 +
              *(float *)(&this->field_0xd4 + (long)p_Var6);
    auVar55 = vrsqrtss_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120));
    auVar57 = vfmadd213ss_fma(ZEXT416((uint)(fVar120 * auVar55._0_4_)),auVar55,ZEXT416(0xc0400000));
    fVar120 = auVar55._0_4_ * -0.5 * auVar57._0_4_;
    auVar24._8_4_ = 0x80000000;
    auVar24._0_8_ = 0x8000000080000000;
    auVar24._12_4_ = 0x80000000;
    auVar54 = vxorps_avx512vl(auVar54,auVar24);
    auVar122 = vbroadcastss_avx512f(ZEXT416((uint)fVar120));
    auVar54 = ZEXT416((uint)(fVar120 * auVar54._0_4_));
    auVar66 = vbroadcastss_avx512f(auVar54);
    if (*(int *)(&this->field_0xd8 + (long)p_Var6) == 0) {
      uVar44 = 0;
      if (0xf < (int)uVar45) {
        uVar44 = uVar45 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar67 = vfmadd132ps_avx512f(*pauVar49,auVar66,auVar122);
          *pauVar49 = auVar67;
          pauVar49 = pauVar49 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar45);
      }
      uVar47 = uVar44 | 8;
      while ((int)uVar47 <= (int)uVar45) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar66._0_32_,auVar122._0_32_);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar54);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        uVar47 = uVar44 + 0x10;
        uVar44 = uVar44 + 8;
      }
      iVar36 = uVar44 + 4;
      while (iVar36 <= (int)uVar45) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar66._0_16_,auVar122._0_16_);
        *(undefined1 (*) [16])*pauVar49 = auVar54;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        iVar36 = uVar44 + 8;
        uVar44 = uVar44 + 4;
      }
      if ((int)uVar44 < (int)uVar45) {
        auVar67 = vpbroadcastq_avx512f();
        uVar48 = 0;
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar70 = vpbroadcastq_avx512f();
          auVar71 = vporq_avx512f(auVar70,auVar68);
          auVar70 = vporq_avx512f(auVar70,auVar69);
          uVar20 = vpcmpuq_avx512f(auVar70,auVar67,2);
          bVar30 = (byte)uVar20;
          uVar20 = vpcmpuq_avx512f(auVar71,auVar67,2);
          bVar31 = (byte)uVar20;
          uVar53 = CONCAT11(bVar31,bVar30);
          piVar1 = (int *)(*pauVar49 + uVar48 * 4);
          auVar70._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
          auVar70._0_4_ = (uint)(bVar30 & 1) * *piVar1;
          auVar70._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
          auVar70._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
          auVar70._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
          auVar70._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
          auVar70._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
          auVar70._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
          auVar70._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
          auVar70._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
          auVar70._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
          auVar70._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
          auVar70._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
          auVar70._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
          auVar70._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
          auVar70._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
          auVar70 = vfmadd213ps_avx512f(auVar70,auVar122,auVar66);
          puVar2 = (uint *)(*pauVar49 + uVar48 * 4);
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar53 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar53 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar53 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar53 >> 6) & 1);
          bVar13 = (bool)((byte)(uVar53 >> 7) & 1);
          bVar14 = (bool)(bVar31 >> 1 & 1);
          bVar15 = (bool)(bVar31 >> 2 & 1);
          bVar16 = (bool)(bVar31 >> 3 & 1);
          bVar17 = (bool)(bVar31 >> 4 & 1);
          bVar18 = (bool)(bVar31 >> 5 & 1);
          bVar19 = (bool)(bVar31 >> 6 & 1);
          *puVar2 = (uint)(bVar30 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar30 & 1) * *puVar2;
          puVar2[1] = (uint)bVar7 * auVar70._4_4_ | (uint)!bVar7 * puVar2[1];
          puVar2[2] = (uint)bVar8 * auVar70._8_4_ | (uint)!bVar8 * puVar2[2];
          puVar2[3] = (uint)bVar9 * auVar70._12_4_ | (uint)!bVar9 * puVar2[3];
          puVar2[4] = (uint)bVar10 * auVar70._16_4_ | (uint)!bVar10 * puVar2[4];
          puVar2[5] = (uint)bVar11 * auVar70._20_4_ | (uint)!bVar11 * puVar2[5];
          puVar2[6] = (uint)bVar12 * auVar70._24_4_ | (uint)!bVar12 * puVar2[6];
          puVar2[7] = (uint)bVar13 * auVar70._28_4_ | (uint)!bVar13 * puVar2[7];
          puVar2[8] = (uint)(bVar31 & 1) * auVar70._32_4_ | (uint)!(bool)(bVar31 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar14 * auVar70._36_4_ | (uint)!bVar14 * puVar2[9];
          puVar2[10] = (uint)bVar15 * auVar70._40_4_ | (uint)!bVar15 * puVar2[10];
          puVar2[0xb] = (uint)bVar16 * auVar70._44_4_ | (uint)!bVar16 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar17 * auVar70._48_4_ | (uint)!bVar17 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar18 * auVar70._52_4_ | (uint)!bVar18 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar19 * auVar70._56_4_ | (uint)!bVar19 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar31 >> 7) * auVar70._60_4_ |
                        (uint)!(bool)(bVar31 >> 7) * puVar2[0xf];
          uVar48 = uVar48 + 0x10;
        } while (((ulong)(uVar45 + ~uVar44) + 0x10 & 0x1fffffff0) != uVar48);
      }
    }
    else {
      uVar44 = 0;
      if (0xf < (int)uVar45) {
        uVar44 = uVar45 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar67 = vfmadd132ps_avx512f(*pauVar49,auVar66,auVar122);
          auVar67 = vfmadd213ps_avx512f(auVar67,*pauVar43,*pauVar50);
          *pauVar49 = auVar67;
          pauVar49 = pauVar49 + 1;
          pauVar43 = pauVar43 + 1;
          pauVar50 = pauVar50 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar45);
      }
      uVar47 = uVar44 | 8;
      while ((int)uVar47 <= (int)uVar45) {
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar66._0_32_,auVar122._0_32_);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),*(undefined1 (*) [32])*pauVar43,
                                  *(undefined1 (*) [32])*pauVar50);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar55);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + 0x20);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
        uVar47 = uVar44 + 0x10;
        uVar44 = uVar44 + 8;
      }
      iVar36 = uVar44 + 4;
      while (iVar36 <= (int)uVar45) {
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar66._0_16_,auVar122._0_16_);
        auVar55 = vfmadd213ps_fma(auVar55,*(undefined1 (*) [16])*pauVar43,
                                  *(undefined1 (*) [16])*pauVar50);
        *(undefined1 (*) [16])*pauVar49 = auVar55;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + 0x10);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
        iVar36 = uVar44 + 8;
        uVar44 = uVar44 + 4;
      }
      if (uVar45 - uVar44 != 0 && (int)uVar44 <= (int)uVar45) {
        lVar52 = 0;
        do {
          auVar55 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),auVar54,
                                    ZEXT416((uint)fVar120));
          auVar55 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar43 + lVar52 * 4)),auVar55,
                                    ZEXT416(*(uint *)(*pauVar50 + lVar52 * 4)));
          *(int *)(*pauVar49 + lVar52 * 4) = auVar55._0_4_;
          lVar52 = lVar52 + 1;
        } while (uVar45 - uVar44 != (int)lVar52);
      }
    }
  }
  else {
    uVar45 = bottom_top_blob->h;
    uVar44 = bottom_top_blob->c;
    if (iVar38 == 3) {
      if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) == iVar4) {
        if (0 < (int)uVar44) {
          pp_Var5 = this->_vptr_LayerNorm_x86_avx512;
          uVar47 = iVar4 * iVar36;
          fVar120 = 1.0 / (float)iVar4;
          auVar66 = vbroadcastss_avx512f(ZEXT416((uint)fVar120));
          uVar51 = uVar47 & 0xfffffff0;
          uVar48 = 0;
          auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar164._8_4_ = 0x80000000;
          auVar164._0_8_ = 0x8000000080000000;
          auVar164._12_4_ = 0x80000000;
          auVar167._8_4_ = 0xc0400000;
          auVar167._0_8_ = 0xc0400000c0400000;
          auVar167._12_4_ = 0xc0400000;
          auVar169._8_4_ = 0xc0400000;
          auVar169._0_8_ = 0xc0400000c0400000;
          auVar169._12_4_ = 0xc0400000;
          auVar169._16_4_ = 0xc0400000;
          auVar169._20_4_ = 0xc0400000;
          auVar169._24_4_ = 0xc0400000;
          auVar169._28_4_ = 0xc0400000;
          auVar171._8_4_ = 0x80000000;
          auVar171._0_8_ = 0x8000000080000000;
          auVar171._12_4_ = 0x80000000;
          auVar171._16_4_ = 0x80000000;
          auVar171._20_4_ = 0x80000000;
          auVar171._24_4_ = 0x80000000;
          auVar171._28_4_ = 0x80000000;
          auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
          auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
          auVar71 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          do {
            if (0 < (int)uVar45) {
              uVar42 = 0;
              do {
                auVar54 = in_ZMM16._0_16_;
                pauVar49 = (undefined1 (*) [64])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar42 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * uVar48 * bottom_top_blob->elemsize);
                auVar55 = in_ZMM17._0_16_;
                pauVar37 = pauVar49;
                if ((int)uVar47 < 0x10) {
                  auVar55 = vxorps_avx512vl(auVar55,auVar55);
                  auVar173 = ZEXT1664(auVar55);
                  uVar39 = 0;
                }
                else {
                  auVar55 = vxorps_avx512vl(auVar55,auVar55);
                  auVar173 = ZEXT1664(auVar55);
                  iVar38 = 0x10;
                  do {
                    auVar173 = vaddps_avx512f(auVar173,*pauVar37);
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar51;
                  } while (iVar38 <= (int)uVar47);
                }
                uVar40 = uVar39 | 8;
                auVar55 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                auVar174 = ZEXT1664(auVar55);
                auVar65 = ZEXT1632(auVar55);
                while ((int)uVar40 <= (int)uVar47) {
                  auVar65 = vaddps_avx512vl(auVar174._0_32_,*(undefined1 (*) [32])*pauVar37);
                  auVar174 = ZEXT3264(auVar65);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar40 = uVar39 + 0x10;
                  uVar39 = uVar39 + 8;
                }
                iVar38 = uVar39 + 4;
                auVar55 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
                while (iVar38 <= (int)uVar47) {
                  auVar55 = vaddps_avx512vl(auVar55,*(undefined1 (*) [16])*pauVar37);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                fVar128 = 0.0;
                if ((int)uVar39 < (int)uVar47) {
                  auVar72 = vpbroadcastq_avx512f();
                  auVar54 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
                  uVar46 = 0;
                  auVar174 = ZEXT1664(auVar54);
                  do {
                    auVar82 = auVar174;
                    auVar174 = vpbroadcastq_avx512f();
                    auVar73 = vporq_avx512f(auVar174,auVar67);
                    auVar174 = vporq_avx512f(auVar174,auVar68);
                    uVar20 = vpcmpuq_avx512f(auVar174,auVar72,2);
                    bVar30 = (byte)uVar20;
                    uVar20 = vpcmpuq_avx512f(auVar73,auVar72,2);
                    bVar31 = (byte)uVar20;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar86._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar86._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar86._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar86._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar86._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar86._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar86._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar86._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar86._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar86._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar86._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar86._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar86._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar86._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar86._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar86._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar174 = vaddps_avx512f(auVar86,auVar82);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar47) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar87._0_4_ =
                       (uint)(bVar30 & 1) * auVar174._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar82._0_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar87._4_4_ = (uint)bVar7 * auVar174._4_4_ | (uint)!bVar7 * auVar82._4_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar87._8_4_ = (uint)bVar7 * auVar174._8_4_ | (uint)!bVar7 * auVar82._8_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar87._12_4_ = (uint)bVar7 * auVar174._12_4_ | (uint)!bVar7 * auVar82._12_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar87._16_4_ = (uint)bVar7 * auVar174._16_4_ | (uint)!bVar7 * auVar82._16_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar87._20_4_ = (uint)bVar7 * auVar174._20_4_ | (uint)!bVar7 * auVar82._20_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar87._24_4_ = (uint)bVar7 * auVar174._24_4_ | (uint)!bVar7 * auVar82._24_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar87._28_4_ = (uint)bVar7 * auVar174._28_4_ | (uint)!bVar7 * auVar82._28_4_;
                  auVar87._32_4_ =
                       (uint)(bVar31 & 1) * auVar174._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar82._32_4_;
                  bVar7 = (bool)(bVar31 >> 1 & 1);
                  auVar87._36_4_ = (uint)bVar7 * auVar174._36_4_ | (uint)!bVar7 * auVar82._36_4_;
                  bVar7 = (bool)(bVar31 >> 2 & 1);
                  auVar87._40_4_ = (uint)bVar7 * auVar174._40_4_ | (uint)!bVar7 * auVar82._40_4_;
                  bVar7 = (bool)(bVar31 >> 3 & 1);
                  auVar87._44_4_ = (uint)bVar7 * auVar174._44_4_ | (uint)!bVar7 * auVar82._44_4_;
                  bVar7 = (bool)(bVar31 >> 4 & 1);
                  auVar87._48_4_ = (uint)bVar7 * auVar174._48_4_ | (uint)!bVar7 * auVar82._48_4_;
                  bVar7 = (bool)(bVar31 >> 5 & 1);
                  auVar87._52_4_ = (uint)bVar7 * auVar174._52_4_ | (uint)!bVar7 * auVar82._52_4_;
                  bVar7 = (bool)(bVar31 >> 6 & 1);
                  auVar87._56_4_ = (uint)bVar7 * auVar174._56_4_ | (uint)!bVar7 * auVar82._56_4_;
                  auVar87._60_4_ =
                       (uint)(bVar31 >> 7) * auVar174._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar82._60_4_;
                  auVar64 = vextractf64x4_avx512f(auVar87,1);
                  auVar174 = vaddps_avx512f(auVar87,ZEXT3264(auVar64));
                  auVar54 = vextractf32x4_avx512vl(auVar174._0_32_,1);
                  auVar57 = vaddps_avx512vl(auVar174._0_16_,auVar54);
                  auVar54 = vshufpd_avx512vl(auVar57,auVar57,1);
                  auVar57 = vaddps_avx512vl(auVar57,auVar54);
                  auVar57 = vhaddps_avx(auVar57,auVar57);
                  fVar128 = auVar57._0_4_;
                }
                auVar64 = vextractf64x4_avx512f(auVar173,1);
                if (iVar36 == 8) {
                  auVar65 = vaddps_avx512vl(auVar173._0_32_,auVar65);
                  auVar65 = vaddps_avx512vl(auVar65,auVar64);
                  auVar60 = vmulps_avx512vl(auVar65,auVar66._0_32_);
                  in_ZMM16 = ZEXT3264(auVar60);
                }
                else {
                  auVar54 = vxorps_avx512vl(auVar54,auVar54);
                  in_ZMM16 = ZEXT1664(auVar54);
                  if (iVar36 == 0x10) {
                    in_ZMM16 = vmulps_avx512f(auVar173,auVar66);
                  }
                }
                if (iVar36 == 4) {
                  auVar65 = vaddps_avx512vl(auVar173._0_32_,auVar65);
                  auVar65 = vaddps_avx512vl(auVar65,auVar64);
                  auVar54 = vextractf32x4_avx512vl(auVar65,1);
                  auVar54 = vaddps_avx512vl(auVar65._0_16_,auVar54);
                  auVar55 = vaddps_avx512vl(auVar54,auVar55);
                  auVar54 = vmulps_avx512vl(auVar55,auVar66._0_16_);
                  in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar54,0);
                }
                in_ZMM18 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
                auVar54 = auVar65._0_16_;
                if (iVar36 == 1) {
                  auVar173 = vaddps_avx512f(auVar173,ZEXT3264(auVar64));
                  auVar89._16_48_ = auVar173._16_48_;
                  auVar57 = vextractf32x4_avx512vl(auVar173._0_32_,1);
                  auVar57 = vaddps_avx512vl(auVar173._0_16_,auVar57);
                  auVar56 = vshufpd_avx512vl(auVar57,auVar57,1);
                  auVar57 = vaddps_avx512vl(auVar57,auVar56);
                  auVar57 = vhaddps_avx(auVar57,auVar57);
                  auVar56 = vextractf32x4_avx512vl(auVar65,1);
                  auVar56 = vaddps_avx512vl(auVar56,auVar54);
                  auVar58 = vshufps_avx512vl(auVar56,auVar55,0x11);
                  auVar56 = vshufps_avx512vl(auVar56,auVar55,0xbb);
                  auVar56 = vaddps_avx512vl(auVar56,auVar58);
                  auVar58 = vshufpd_avx512vl(auVar56,auVar56,1);
                  auVar56 = vaddps_avx512vl(auVar56,auVar58);
                  auVar56 = vhaddps_avx(auVar56,auVar56);
                  auVar89._0_16_ = in_ZMM16._0_16_;
                  auVar88._4_60_ = auVar89._4_60_;
                  auVar88._0_4_ = (fVar128 + auVar57._0_4_ + auVar56._0_4_) * fVar120;
                  in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar88._0_16_,0);
                }
                auVar56 = in_ZMM16._0_16_;
                auVar57 = auVar56;
                if (iVar36 != 4) {
                  auVar57 = vbroadcastss_avx512vl(auVar56);
                }
                auVar65 = in_ZMM16._0_32_;
                if (iVar36 != 8) {
                  auVar65 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
                }
                auVar173 = in_ZMM16;
                if (iVar36 != 0x10) {
                  auVar173 = vinsertf64x4_avx512f(ZEXT3264(auVar65),auVar65,1);
                }
                auVar119 = auVar173._16_48_;
                pauVar37 = pauVar49;
                if ((int)uVar47 < 0x10) {
                  auVar54 = vxorps_avx512vl(auVar54,auVar54);
                  in_ZMM19 = ZEXT1664(auVar54);
                  uVar39 = 0;
                }
                else {
                  auVar54 = vxorps_avx512vl(auVar54,auVar54);
                  in_ZMM19 = ZEXT1664(auVar54);
                  iVar38 = 0x10;
                  do {
                    auVar174 = vsubps_avx512f(*pauVar37,auVar173);
                    in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar174,auVar174);
                    auVar119 = in_ZMM19._16_48_;
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar51;
                  } while (iVar38 <= (int)uVar47);
                }
                uVar40 = uVar39 | 8;
                auVar90._0_16_ = vxorps_avx512vl(auVar55,auVar55);
                auVar90._16_48_ = auVar119;
                in_ZMM20 = ZEXT1664(auVar90._0_16_);
                auVar64 = auVar119._16_32_;
                while ((int)uVar40 <= (int)uVar47) {
                  auVar64 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar65);
                  auVar90._0_32_ = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar64,auVar64);
                  in_ZMM20 = ZEXT3264(auVar90._0_32_);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar40 = uVar39 + 0x10;
                  uVar39 = uVar39 + 8;
                  auVar64 = auVar90._32_32_;
                }
                iVar38 = uVar39 + 4;
                auVar54 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
                while (iVar38 <= (int)uVar47) {
                  auVar55 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar57);
                  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar55,auVar55);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                fVar128 = 0.0;
                if ((int)uVar39 < (int)uVar47) {
                  auVar173 = vpbroadcastq_avx512f();
                  auVar174 = vbroadcastss_avx512f(auVar56);
                  auVar57 = auVar174._0_16_;
                  auVar55 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
                  uVar46 = 0;
                  in_ZMM24 = ZEXT1664(auVar55);
                  do {
                    auVar82 = in_ZMM24;
                    auVar72 = vpbroadcastq_avx512f();
                    auVar73 = vporq_avx512f(auVar72,auVar67);
                    auVar72 = vporq_avx512f(auVar72,auVar68);
                    uVar20 = vpcmpuq_avx512f(auVar72,auVar173,2);
                    bVar30 = (byte)uVar20;
                    uVar20 = vpcmpuq_avx512f(auVar73,auVar173,2);
                    bVar31 = (byte)uVar20;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar91._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar91._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar91._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar91._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar91._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar91._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar91._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar91._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar91._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar91._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar91._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar91._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar91._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar91._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar91._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar91._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar72 = vsubps_avx512f(auVar91,auVar174);
                    in_ZMM24 = vfmadd213ps_avx512f(auVar72,auVar72,auVar82);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar47) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar92._0_4_ =
                       (uint)(bVar30 & 1) * in_ZMM24._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar82._0_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar92._4_4_ = (uint)bVar7 * in_ZMM24._4_4_ | (uint)!bVar7 * auVar82._4_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar92._8_4_ = (uint)bVar7 * in_ZMM24._8_4_ | (uint)!bVar7 * auVar82._8_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar92._12_4_ = (uint)bVar7 * in_ZMM24._12_4_ | (uint)!bVar7 * auVar82._12_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar92._16_4_ = (uint)bVar7 * in_ZMM24._16_4_ | (uint)!bVar7 * auVar82._16_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar92._20_4_ = (uint)bVar7 * in_ZMM24._20_4_ | (uint)!bVar7 * auVar82._20_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar92._24_4_ = (uint)bVar7 * in_ZMM24._24_4_ | (uint)!bVar7 * auVar82._24_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar92._28_4_ = (uint)bVar7 * in_ZMM24._28_4_ | (uint)!bVar7 * auVar82._28_4_;
                  auVar92._32_4_ =
                       (uint)(bVar31 & 1) * in_ZMM24._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar82._32_4_;
                  bVar7 = (bool)(bVar31 >> 1 & 1);
                  auVar92._36_4_ = (uint)bVar7 * in_ZMM24._36_4_ | (uint)!bVar7 * auVar82._36_4_;
                  bVar7 = (bool)(bVar31 >> 2 & 1);
                  auVar92._40_4_ = (uint)bVar7 * in_ZMM24._40_4_ | (uint)!bVar7 * auVar82._40_4_;
                  bVar7 = (bool)(bVar31 >> 3 & 1);
                  auVar92._44_4_ = (uint)bVar7 * in_ZMM24._44_4_ | (uint)!bVar7 * auVar82._44_4_;
                  bVar7 = (bool)(bVar31 >> 4 & 1);
                  auVar92._48_4_ = (uint)bVar7 * in_ZMM24._48_4_ | (uint)!bVar7 * auVar82._48_4_;
                  bVar7 = (bool)(bVar31 >> 5 & 1);
                  auVar92._52_4_ = (uint)bVar7 * in_ZMM24._52_4_ | (uint)!bVar7 * auVar82._52_4_;
                  bVar7 = (bool)(bVar31 >> 6 & 1);
                  auVar92._56_4_ = (uint)bVar7 * in_ZMM24._56_4_ | (uint)!bVar7 * auVar82._56_4_;
                  auVar92._60_4_ =
                       (uint)(bVar31 >> 7) * in_ZMM24._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar82._60_4_;
                  auVar65 = vextractf64x4_avx512f(auVar92,1);
                  auVar173 = vaddps_avx512f(auVar92,ZEXT3264(auVar65));
                  auVar64 = auVar173._32_32_;
                  auVar146._0_4_ = auVar173._0_4_ + auVar173._16_4_;
                  auVar146._4_4_ = auVar173._4_4_ + auVar173._20_4_;
                  auVar146._8_4_ = auVar173._8_4_ + auVar173._24_4_;
                  auVar146._12_4_ = auVar173._12_4_ + auVar173._28_4_;
                  auVar55 = vshufpd_avx(auVar146,auVar146,1);
                  auVar147._0_4_ = auVar146._0_4_ + auVar55._0_4_;
                  auVar147._4_4_ = auVar146._4_4_ + auVar55._4_4_;
                  auVar147._8_4_ = auVar146._8_4_ + auVar55._8_4_;
                  auVar147._12_4_ = auVar146._12_4_ + auVar55._12_4_;
                  auVar55 = vhaddps_avx(auVar147,auVar147);
                  fVar128 = auVar55._0_4_;
                }
                auVar55 = vxorps_avx512vl(auVar57,auVar57);
                in_ZMM17 = ZEXT1664(auVar55);
                if (iVar36 == 0x10) {
                  in_ZMM17 = vmulps_avx512f(in_ZMM19,auVar66);
                  auVar64 = in_ZMM17._32_32_;
                }
                auVar93._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
                auVar93._32_32_ = auVar64;
                auVar119 = auVar93._16_48_;
                if (iVar36 == 8) {
                  auVar65 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
                  auVar65 = vaddps_avx512vl(auVar65,auVar93._0_32_);
                  in_ZMM20 = ZEXT3264(auVar65);
                  auVar65 = vmulps_avx512vl(auVar65,auVar66._0_32_);
                  in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar65,0);
                  auVar119 = in_ZMM17._16_48_;
                }
                if (iVar36 == 4) {
                  auVar65 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
                  auVar65 = vaddps_avx512vl(auVar65,auVar93._0_32_);
                  in_ZMM20 = ZEXT3264(auVar65);
                  auVar55 = vextractf32x4_avx512vl(auVar65,1);
                  auVar55 = vaddps_avx512vl(auVar65._0_16_,auVar55);
                  auVar54 = vaddps_avx512vl(auVar55,auVar54);
                  auVar55 = vmulps_avx512vl(auVar54,auVar66._0_16_);
                  in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar55,0);
                  auVar119 = in_ZMM17._16_48_;
                }
                if (iVar36 == 1) {
                  auVar173 = vaddps_avx512f(in_ZMM19,ZEXT3264(auVar93._0_32_));
                  auVar95._16_48_ = auVar173._16_48_;
                  auVar55 = vextractf32x4_avx512vl(auVar173._0_32_,1);
                  auVar55 = vaddps_avx512vl(auVar173._0_16_,auVar55);
                  auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
                  auVar55 = vaddps_avx512vl(auVar55,auVar57);
                  auVar55 = vhaddps_avx(auVar55,auVar55);
                  auVar57 = vextractf32x4_avx512vl(in_ZMM20._0_32_,1);
                  auVar57 = vaddps_avx512vl(auVar57,in_ZMM20._0_16_);
                  auVar58 = vshufps_avx512vl(auVar57,auVar54,0x11);
                  auVar54 = vshufps_avx512vl(auVar57,auVar54,0xbb);
                  auVar54 = vaddps_avx512vl(auVar54,auVar58);
                  auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
                  in_ZMM19 = ZEXT1664(auVar57);
                  auVar54 = vaddps_avx512vl(auVar54,auVar57);
                  auVar54 = vhaddps_avx(auVar54,auVar54);
                  auVar95._0_16_ = in_ZMM17._0_16_;
                  auVar94._4_60_ = auVar95._4_60_;
                  auVar94._0_4_ = (fVar128 + auVar55._0_4_ + auVar54._0_4_) * fVar120;
                  in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar94._0_16_,0);
                  auVar119 = in_ZMM17._16_48_;
                }
                auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
                if (iVar36 < 8) {
                  auVar55 = in_ZMM17._0_16_;
                  if (iVar36 == 1) {
                    auVar57 = vaddss_avx512f(auVar55,auVar54);
                    auVar54 = vrsqrtss_avx(auVar57,auVar57);
                    auVar57 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar54._0_4_)),
                                                  auVar54,ZEXT416(0xc0400000));
                    auVar54 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
                    fVar128 = auVar54._0_4_ * auVar57._0_4_;
                    auVar97._16_48_ = auVar119;
                    auVar97._0_16_ = auVar55;
                    auVar96._4_60_ = auVar97._4_60_;
                    auVar96._0_4_ = fVar128;
                    in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar96._0_16_,0);
                    auVar99._16_48_ = in_ZMM17._16_48_;
                    auVar54 = vxorps_avx512vl(auVar56,auVar164);
                    auVar99._0_16_ = auVar56;
                    auVar98._4_60_ = auVar99._4_60_;
                    auVar98._0_4_ = fVar128 * auVar54._0_4_;
                    in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar98._0_16_,0);
                  }
                  else if (iVar36 == 4) {
                    auVar54 = vbroadcastss_avx512vl(auVar54);
                    auVar55 = vaddps_avx512vl(auVar55,auVar54);
                    auVar54 = vrsqrtps_avx(auVar55);
                    auVar148._0_4_ = auVar55._0_4_ * auVar54._0_4_;
                    auVar148._4_4_ = auVar55._4_4_ * auVar54._4_4_;
                    auVar148._8_4_ = auVar55._8_4_ * auVar54._8_4_;
                    auVar148._12_4_ = auVar55._12_4_ * auVar54._12_4_;
                    auVar55 = vfmadd213ps_fma(auVar148,auVar54,auVar167);
                    auVar149._0_4_ = auVar54._0_4_ * -0.5 * auVar55._0_4_;
                    auVar149._4_4_ = auVar54._4_4_ * -0.5 * auVar55._4_4_;
                    auVar149._8_4_ = auVar54._8_4_ * -0.5 * auVar55._8_4_;
                    auVar149._12_4_ = auVar54._12_4_ * -0.5 * auVar55._12_4_;
                    auVar54 = vxorps_avx512vl(auVar56,auVar164);
                    auVar161._0_4_ = auVar149._0_4_ * auVar54._0_4_;
                    auVar161._4_4_ = auVar149._4_4_ * auVar54._4_4_;
                    auVar161._8_4_ = auVar149._8_4_ * auVar54._8_4_;
                    auVar161._12_4_ = auVar149._12_4_ * auVar54._12_4_;
                    in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar149,0);
                    in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar161,0);
                  }
                }
                else if (iVar36 == 8) {
                  auVar65 = vbroadcastss_avx512vl(auVar54);
                  auVar64 = vaddps_avx512vl(in_ZMM17._0_32_,auVar65);
                  auVar65 = vrsqrtps_avx(auVar64);
                  auVar32._4_4_ = auVar64._4_4_ * auVar65._4_4_;
                  auVar32._0_4_ = auVar64._0_4_ * auVar65._0_4_;
                  auVar32._8_4_ = auVar64._8_4_ * auVar65._8_4_;
                  auVar32._12_4_ = auVar64._12_4_ * auVar65._12_4_;
                  auVar32._16_4_ = auVar64._16_4_ * auVar65._16_4_;
                  auVar32._20_4_ = auVar64._20_4_ * auVar65._20_4_;
                  auVar32._24_4_ = auVar64._24_4_ * auVar65._24_4_;
                  auVar32._28_4_ = auVar64._28_4_;
                  auVar54 = vfmadd213ps_fma(auVar32,auVar65,auVar169);
                  auVar156._0_4_ = auVar65._0_4_ * -0.5 * auVar54._0_4_;
                  auVar156._4_4_ = auVar65._4_4_ * -0.5 * auVar54._4_4_;
                  auVar156._8_4_ = auVar65._8_4_ * -0.5 * auVar54._8_4_;
                  auVar156._12_4_ = auVar65._12_4_ * -0.5 * auVar54._12_4_;
                  auVar156._16_4_ = auVar65._16_4_ * -0.5 * 0.0;
                  auVar156._20_4_ = auVar65._20_4_ * -0.5 * 0.0;
                  auVar156._24_4_ = auVar65._24_4_ * -0.5 * 0.0;
                  auVar156._28_4_ = 0;
                  auVar65 = vxorps_avx512vl(in_ZMM16._0_32_,auVar171);
                  auVar33._4_4_ = auVar156._4_4_ * auVar65._4_4_;
                  auVar33._0_4_ = auVar156._0_4_ * auVar65._0_4_;
                  auVar33._8_4_ = auVar156._8_4_ * auVar65._8_4_;
                  auVar33._12_4_ = auVar156._12_4_ * auVar65._12_4_;
                  auVar33._16_4_ = auVar156._16_4_ * auVar65._16_4_;
                  auVar33._20_4_ = auVar156._20_4_ * auVar65._20_4_;
                  auVar33._24_4_ = auVar156._24_4_ * auVar65._24_4_;
                  auVar33._28_4_ = auVar65._28_4_;
                  in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar156,0);
                  in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar33,0);
                }
                else if (iVar36 == 0x10) {
                  auVar173 = vbroadcastss_avx512f(auVar54);
                  auVar173 = vaddps_avx512f(in_ZMM17,auVar173);
                  auVar174 = vrsqrt14ps_avx512f(auVar173);
                  auVar173 = vmulps_avx512f(auVar173,auVar174);
                  auVar173 = vfmadd213ps_avx512f(auVar173,auVar174,auVar69);
                  auVar174 = vmulps_avx512f(auVar174,auVar70);
                  in_ZMM17 = vmulps_avx512f(auVar174,auVar173);
                  auVar173 = vxorps_avx512dq(in_ZMM16,auVar71);
                  in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar173);
                }
                auVar55 = in_ZMM17._0_16_;
                auVar65 = in_ZMM17._0_32_;
                auVar54 = in_ZMM16._0_16_;
                auVar64 = in_ZMM16._0_32_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
                  auVar57 = auVar55;
                  if (iVar36 != 4) {
                    auVar57 = vbroadcastss_avx512vl(auVar55);
                  }
                  in_ZMM18 = ZEXT1664(auVar57);
                  auVar56 = auVar54;
                  if (iVar36 != 4) {
                    auVar56 = vbroadcastss_avx512vl(auVar54);
                  }
                  in_ZMM19 = ZEXT1664(auVar56);
                  if (iVar36 != 8) {
                    auVar65 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
                  }
                  in_ZMM20 = ZEXT3264(auVar65);
                  if (iVar36 != 8) {
                    auVar64 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
                  }
                  auVar173 = in_ZMM16;
                  auVar174 = in_ZMM17;
                  if (iVar36 != 0x10) {
                    auVar174 = vinsertf64x4_avx512f(in_ZMM20,auVar65,1);
                    auVar173 = vinsertf64x4_avx512f(ZEXT3264(auVar64),auVar64,1);
                  }
                  uVar39 = 0;
                  if (0xf < (int)uVar47) {
                    iVar38 = 0x10;
                    do {
                      auVar72 = vfmadd132ps_avx512f(*pauVar49,auVar173,auVar174);
                      *pauVar49 = auVar72;
                      pauVar49 = pauVar49 + 1;
                      iVar38 = iVar38 + 0x10;
                      uVar39 = uVar51;
                    } while (iVar38 <= (int)uVar47);
                  }
                  uVar40 = uVar39 | 8;
                  while ((int)uVar40 <= (int)uVar47) {
                    auVar60 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar64,auVar65);
                    *(undefined1 (*) [32])*pauVar49 = auVar60;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                    uVar40 = uVar39 + 0x10;
                    uVar39 = uVar39 + 8;
                  }
                  iVar38 = uVar39 + 4;
                  while (iVar38 <= (int)uVar47) {
                    auVar58 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar56,auVar57);
                    *(undefined1 (*) [16])*pauVar49 = auVar58;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                    iVar38 = uVar39 + 8;
                    uVar39 = uVar39 + 4;
                  }
                  if ((int)uVar39 < (int)uVar47) {
                    auVar173 = vpbroadcastq_avx512f();
                    in_ZMM17 = vbroadcastss_avx512f(auVar55);
                    in_ZMM16 = vbroadcastss_avx512f(auVar54);
                    uVar46 = 0;
                    do {
                      auVar174 = vpbroadcastq_avx512f();
                      in_ZMM18 = vporq_avx512f(auVar174,auVar67);
                      auVar174 = vporq_avx512f(auVar174,auVar68);
                      uVar20 = vpcmpuq_avx512f(auVar174,auVar173,2);
                      bVar30 = (byte)uVar20;
                      uVar20 = vpcmpuq_avx512f(in_ZMM18,auVar173,2);
                      bVar31 = (byte)uVar20;
                      uVar53 = CONCAT11(bVar31,bVar30);
                      piVar1 = (int *)(*pauVar49 + uVar46 * 4);
                      auVar101._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                      auVar101._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                      auVar101._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                      auVar101._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                      auVar101._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                      auVar101._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                      auVar101._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                      auVar101._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                      auVar101._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                      auVar101._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                      auVar101._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                      auVar101._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                      auVar101._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                      auVar101._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                      auVar101._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                      auVar101._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                      auVar72 = vfmadd213ps_avx512f(auVar101,in_ZMM17,in_ZMM16);
                      auVar174 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
                      auVar102._0_4_ =
                           (uint)(bVar30 & 1) * auVar72._0_4_ |
                           (uint)!(bool)(bVar30 & 1) * auVar174._0_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                      auVar102._4_4_ = (uint)bVar7 * auVar72._4_4_ | (uint)!bVar7 * auVar174._4_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                      auVar102._8_4_ = (uint)bVar7 * auVar72._8_4_ | (uint)!bVar7 * auVar174._8_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                      auVar102._12_4_ =
                           (uint)bVar7 * auVar72._12_4_ | (uint)!bVar7 * auVar174._12_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                      auVar102._16_4_ =
                           (uint)bVar7 * auVar72._16_4_ | (uint)!bVar7 * auVar174._16_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                      auVar102._20_4_ =
                           (uint)bVar7 * auVar72._20_4_ | (uint)!bVar7 * auVar174._20_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                      auVar102._24_4_ =
                           (uint)bVar7 * auVar72._24_4_ | (uint)!bVar7 * auVar174._24_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                      auVar102._28_4_ =
                           (uint)bVar7 * auVar72._28_4_ | (uint)!bVar7 * auVar174._28_4_;
                      auVar102._32_4_ =
                           (uint)(bVar31 & 1) * auVar72._32_4_ |
                           (uint)!(bool)(bVar31 & 1) * auVar174._32_4_;
                      bVar7 = (bool)(bVar31 >> 1 & 1);
                      auVar102._36_4_ =
                           (uint)bVar7 * auVar72._36_4_ | (uint)!bVar7 * auVar174._36_4_;
                      bVar7 = (bool)(bVar31 >> 2 & 1);
                      auVar102._40_4_ =
                           (uint)bVar7 * auVar72._40_4_ | (uint)!bVar7 * auVar174._40_4_;
                      bVar7 = (bool)(bVar31 >> 3 & 1);
                      auVar102._44_4_ =
                           (uint)bVar7 * auVar72._44_4_ | (uint)!bVar7 * auVar174._44_4_;
                      bVar7 = (bool)(bVar31 >> 4 & 1);
                      auVar102._48_4_ =
                           (uint)bVar7 * auVar72._48_4_ | (uint)!bVar7 * auVar174._48_4_;
                      bVar7 = (bool)(bVar31 >> 5 & 1);
                      auVar102._52_4_ =
                           (uint)bVar7 * auVar72._52_4_ | (uint)!bVar7 * auVar174._52_4_;
                      bVar7 = (bool)(bVar31 >> 6 & 1);
                      auVar102._56_4_ =
                           (uint)bVar7 * auVar72._56_4_ | (uint)!bVar7 * auVar174._56_4_;
                      auVar102._60_4_ =
                           (uint)(bVar31 >> 7) * auVar72._60_4_ |
                           (uint)!(bool)(bVar31 >> 7) * auVar174._60_4_;
                      *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar102;
                      uVar46 = uVar46 + 0x10;
                    } while (((ulong)(~uVar39 + uVar47) + 0x10 & 0x1fffffff0) != uVar46);
                  }
                }
                else {
                  pauVar37 = pauVar43;
                  pauVar41 = pauVar50;
                  if (0xf < (int)uVar47 && iVar36 == 0x10) {
                    iVar38 = 0x10;
                    do {
                      auVar173 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar37));
                      auVar174 = vfmadd132ps_avx512f(*pauVar49,in_ZMM16,in_ZMM17);
                      uVar3 = *(undefined4 *)*pauVar41;
                      auVar27._4_4_ = uVar3;
                      auVar27._0_4_ = uVar3;
                      auVar27._8_4_ = uVar3;
                      auVar27._12_4_ = uVar3;
                      auVar27._16_4_ = uVar3;
                      auVar27._20_4_ = uVar3;
                      auVar27._24_4_ = uVar3;
                      auVar27._28_4_ = uVar3;
                      auVar27._32_4_ = uVar3;
                      auVar27._36_4_ = uVar3;
                      auVar27._40_4_ = uVar3;
                      auVar27._44_4_ = uVar3;
                      auVar27._48_4_ = uVar3;
                      auVar27._52_4_ = uVar3;
                      auVar27._56_4_ = uVar3;
                      auVar27._60_4_ = uVar3;
                      auVar173 = vfmadd213ps_avx512f(auVar174,auVar173,auVar27);
                      *pauVar49 = auVar173;
                      pauVar49 = pauVar49 + 1;
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                      iVar38 = iVar38 + 0x10;
                    } while (iVar38 <= (int)uVar47);
                  }
                  if (iVar36 == 8) {
                    uVar39 = 8;
                    if (0xf < (int)uVar47) {
                      auVar173 = vinsertf64x4_avx512f(in_ZMM17,auVar65,1);
                      in_ZMM18 = vinsertf64x4_avx512f(in_ZMM16,auVar64,1);
                      iVar38 = 0x10;
                      do {
                        auVar174 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar122,
                                                     ZEXT464(*(uint *)(*pauVar37 + 4)));
                        in_ZMM20 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar41),auVar122,
                                                     ZEXT464(*(uint *)(*pauVar41 + 4)));
                        auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar173);
                        in_ZMM19 = vfmadd213ps_avx512f(auVar72,auVar174,in_ZMM20);
                        *pauVar49 = in_ZMM19;
                        pauVar49 = pauVar49 + 1;
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar47 | 8;
                      } while (iVar38 <= (int)uVar47);
                    }
                    for (; (int)uVar39 <= (int)uVar47; uVar39 = uVar39 + 8) {
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar157._4_4_ = uVar3;
                      auVar157._0_4_ = uVar3;
                      auVar157._8_4_ = uVar3;
                      auVar157._12_4_ = uVar3;
                      auVar157._16_4_ = uVar3;
                      auVar157._20_4_ = uVar3;
                      auVar157._24_4_ = uVar3;
                      auVar157._28_4_ = uVar3;
                      auVar60 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [32])*pauVar49,auVar64,auVar65);
                      uVar3 = *(undefined4 *)*pauVar41;
                      auVar25._4_4_ = uVar3;
                      auVar25._0_4_ = uVar3;
                      auVar25._8_4_ = uVar3;
                      auVar25._12_4_ = uVar3;
                      auVar25._16_4_ = uVar3;
                      auVar25._20_4_ = uVar3;
                      auVar25._24_4_ = uVar3;
                      auVar25._28_4_ = uVar3;
                      auVar60 = vfmadd213ps_avx512vl(auVar60,auVar157,auVar25);
                      *(undefined1 (*) [32])*pauVar49 = auVar60;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                    }
                  }
                  if (iVar36 == 4) {
                    uVar39 = 0;
                    if (0xf < (int)uVar47) {
                      auVar173 = vinsertf64x4_avx512f(in_ZMM17,auVar65,1);
                      auVar173 = vpermpd_avx512f(auVar173,0x44);
                      auVar174 = vinsertf64x4_avx512f(in_ZMM16,auVar64,1);
                      in_ZMM18 = vpermpd_avx512f(auVar174,0x44);
                      iVar38 = 0x10;
                      do {
                        auVar174 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                        auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                        auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                                   ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar60 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                        auVar174 = vinsertf64x4_avx512f(auVar174,auVar60,0);
                        auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 8)));
                        auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 0xc)));
                        auVar100._0_48_ = auVar174._0_48_;
                        auVar100._48_8_ = auVar72._48_8_;
                        auVar100._56_8_ = auVar72._56_8_;
                        auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                                   ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                        auVar60 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                        auVar174 = vinsertf64x4_avx512f(auVar73,auVar60,0);
                        in_ZMM19._0_48_ = auVar174._0_48_;
                        in_ZMM19._48_8_ = auVar82._48_8_;
                        in_ZMM19._56_8_ = auVar82._56_8_;
                        auVar174 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar173);
                        in_ZMM20 = vfmadd213ps_avx512f(auVar174,auVar100,in_ZMM19);
                        *pauVar49 = in_ZMM20;
                        pauVar49 = pauVar49 + 1;
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                        pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar51;
                      } while (iVar38 <= (int)uVar47);
                    }
                    if ((int)(uVar39 | 8) <= (int)uVar47) {
                      auVar65 = vpermpd_avx512vl(auVar65,0x44);
                      auVar64 = vpermpd_avx512vl(auVar64,0x44);
                      in_ZMM18 = ZEXT3264(auVar64);
                      uVar40 = uVar39;
                      do {
                        auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                                   ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar56 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                                   ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                        auVar60 = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                        auVar59 = vpermpd_avx512vl(ZEXT1632(auVar56),0x50);
                        in_ZMM19 = ZEXT3264(auVar59);
                        auVar61 = vfmadd132ps_avx512vl
                                            (*(undefined1 (*) [32])*pauVar49,auVar64,auVar65);
                        auVar60 = vfmadd213ps_avx512vl(auVar61,auVar60,auVar59);
                        in_ZMM20 = ZEXT3264(auVar60);
                        *(undefined1 (*) [32])*pauVar49 = auVar60;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                        uVar39 = uVar40 + 8;
                        iVar38 = uVar40 + 0x10;
                        uVar40 = uVar39;
                      } while (iVar38 <= (int)uVar47);
                    }
                    while (uVar39 = uVar39 + 4, (int)uVar39 <= (int)uVar47) {
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar150._4_4_ = uVar3;
                      auVar150._0_4_ = uVar3;
                      auVar150._8_4_ = uVar3;
                      auVar150._12_4_ = uVar3;
                      auVar57 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [16])*pauVar49,auVar54,auVar55);
                      uVar3 = *(undefined4 *)*pauVar41;
                      auVar21._4_4_ = uVar3;
                      auVar21._0_4_ = uVar3;
                      auVar21._8_4_ = uVar3;
                      auVar21._12_4_ = uVar3;
                      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar150,auVar21);
                      *(undefined1 (*) [16])*pauVar49 = auVar57;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                    }
                  }
                  if (iVar36 == 1) {
                    in_ZMM18 = vbroadcastss_avx512f(auVar55);
                    in_ZMM19 = vbroadcastss_avx512f(auVar54);
                    uVar39 = 0;
                    if (0xf < (int)uVar47) {
                      iVar38 = 0x10;
                      do {
                        auVar173 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,in_ZMM18);
                        auVar173 = vfmadd213ps_avx512f(auVar173,*pauVar37,*pauVar41);
                        *pauVar49 = auVar173;
                        pauVar49 = pauVar49 + 1;
                        pauVar37 = pauVar37 + 1;
                        pauVar41 = pauVar41 + 1;
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar51;
                      } while (iVar38 <= (int)uVar47);
                    }
                    uVar40 = uVar39 | 8;
                    while ((int)uVar40 <= (int)uVar47) {
                      auVar65 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [32])*pauVar49,in_ZMM19._0_32_,
                                           in_ZMM18._0_32_);
                      auVar57 = vfmadd213ps_fma(auVar65,*(undefined1 (*) [32])*pauVar37,
                                                *(undefined1 (*) [32])*pauVar41);
                      *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar57);
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
                      uVar40 = uVar39 + 0x10;
                      uVar39 = uVar39 + 8;
                    }
                    iVar38 = uVar39 + 4;
                    while (iVar38 <= (int)uVar47) {
                      auVar57 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [16])*pauVar49,in_ZMM19._0_16_,
                                           in_ZMM18._0_16_);
                      auVar57 = vfmadd213ps_fma(auVar57,*(undefined1 (*) [16])*pauVar37,
                                                *(undefined1 (*) [16])*pauVar41);
                      *(undefined1 (*) [16])*pauVar49 = auVar57;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                      iVar38 = uVar39 + 8;
                      uVar39 = uVar39 + 4;
                    }
                    if (uVar47 - uVar39 != 0 && (int)uVar39 <= (int)uVar47) {
                      lVar52 = 0;
                      do {
                        auVar57 = vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),
                                                      auVar54,auVar55);
                        auVar57 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar37 + lVar52 * 4)),auVar57
                                                  ,ZEXT416(*(uint *)(*pauVar41 + lVar52 * 4)));
                        *(int *)(*pauVar49 + lVar52 * 4) = auVar57._0_4_;
                        lVar52 = lVar52 + 1;
                      } while (uVar47 - uVar39 != (int)lVar52);
                    }
                  }
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar45);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar44);
        }
      }
      else if (0 < (int)uVar44) {
        pp_Var5 = this->_vptr_LayerNorm_x86_avx512;
        uVar47 = uVar45 * iVar4 * iVar36;
        fVar120 = 1.0 / (float)(int)(uVar45 * iVar4);
        auVar66 = vbroadcastss_avx512f(ZEXT416((uint)fVar120));
        uVar45 = uVar47 & 0xfffffff0;
        uVar48 = 0;
        auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar165._8_4_ = 0x80000000;
        auVar165._0_8_ = 0x8000000080000000;
        auVar165._12_4_ = 0x80000000;
        auVar168._8_4_ = 0xc0400000;
        auVar168._0_8_ = 0xc0400000c0400000;
        auVar168._12_4_ = 0xc0400000;
        auVar170._8_4_ = 0xc0400000;
        auVar170._0_8_ = 0xc0400000c0400000;
        auVar170._12_4_ = 0xc0400000;
        auVar170._16_4_ = 0xc0400000;
        auVar170._20_4_ = 0xc0400000;
        auVar170._24_4_ = 0xc0400000;
        auVar170._28_4_ = 0xc0400000;
        auVar172._8_4_ = 0x80000000;
        auVar172._0_8_ = 0x8000000080000000;
        auVar172._12_4_ = 0x80000000;
        auVar172._16_4_ = 0x80000000;
        auVar172._20_4_ = 0x80000000;
        auVar172._24_4_ = 0x80000000;
        auVar172._28_4_ = 0x80000000;
        auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar71 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        do {
          auVar57 = in_ZMM20._0_16_;
          auVar55 = in_ZMM16._0_16_;
          pauVar49 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar48 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar173 = ZEXT1664(auVar54);
          pauVar37 = pauVar49;
          uVar51 = 0;
          if (0xf < (int)uVar47) {
            iVar38 = 0x10;
            do {
              auVar173 = vaddps_avx512f(auVar173,*pauVar37);
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar51 = uVar45;
            } while (iVar38 <= (int)uVar47);
          }
          uVar39 = uVar51 | 8;
          auVar54 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar174 = ZEXT1664(auVar54);
          auVar65 = ZEXT1632(auVar54);
          while ((int)uVar39 <= (int)uVar47) {
            auVar65 = vaddps_avx512vl(auVar174._0_32_,*(undefined1 (*) [32])*pauVar37);
            auVar174 = ZEXT3264(auVar65);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar51 + 0x10;
            uVar51 = uVar51 + 8;
          }
          iVar38 = uVar51 + 4;
          auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          while (iVar38 <= (int)uVar47) {
            auVar54 = vaddps_avx512vl(auVar54,*(undefined1 (*) [16])*pauVar37);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar51 + 8;
            uVar51 = uVar51 + 4;
          }
          fVar128 = 0.0;
          if ((int)uVar51 < (int)uVar47) {
            auVar72 = vpbroadcastq_avx512f();
            auVar55 = vxorps_avx512vl(auVar57,auVar57);
            uVar42 = 0;
            auVar174 = ZEXT1664(auVar55);
            do {
              auVar82 = auVar174;
              auVar174 = vpbroadcastq_avx512f();
              auVar73 = vporq_avx512f(auVar174,auVar67);
              auVar174 = vporq_avx512f(auVar174,auVar68);
              uVar20 = vpcmpuq_avx512f(auVar174,auVar72,2);
              bVar30 = (byte)uVar20;
              uVar20 = vpcmpuq_avx512f(auVar73,auVar72,2);
              bVar31 = (byte)uVar20;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar42 * 4);
              auVar103._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar103._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar103._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar103._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar103._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar103._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar103._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar103._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar103._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar103._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar103._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar103._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar103._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar103._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar103._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar103._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar174 = vaddps_avx512f(auVar103,auVar82);
              auVar57 = auVar174._0_16_;
              uVar42 = uVar42 + 0x10;
            } while (((ulong)(~uVar51 + uVar47) + 0x10 & 0x1fffffff0) != uVar42);
            auVar104._0_4_ =
                 (uint)(bVar30 & 1) * auVar174._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar82._0_4_;
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            auVar104._4_4_ = (uint)bVar7 * auVar174._4_4_ | (uint)!bVar7 * auVar82._4_4_;
            bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
            auVar104._8_4_ = (uint)bVar7 * auVar174._8_4_ | (uint)!bVar7 * auVar82._8_4_;
            bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
            auVar104._12_4_ = (uint)bVar7 * auVar174._12_4_ | (uint)!bVar7 * auVar82._12_4_;
            bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
            auVar104._16_4_ = (uint)bVar7 * auVar174._16_4_ | (uint)!bVar7 * auVar82._16_4_;
            bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
            auVar104._20_4_ = (uint)bVar7 * auVar174._20_4_ | (uint)!bVar7 * auVar82._20_4_;
            bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
            auVar104._24_4_ = (uint)bVar7 * auVar174._24_4_ | (uint)!bVar7 * auVar82._24_4_;
            bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
            auVar104._28_4_ = (uint)bVar7 * auVar174._28_4_ | (uint)!bVar7 * auVar82._28_4_;
            auVar104._32_4_ =
                 (uint)(bVar31 & 1) * auVar174._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar82._32_4_;
            bVar7 = (bool)(bVar31 >> 1 & 1);
            auVar104._36_4_ = (uint)bVar7 * auVar174._36_4_ | (uint)!bVar7 * auVar82._36_4_;
            bVar7 = (bool)(bVar31 >> 2 & 1);
            auVar104._40_4_ = (uint)bVar7 * auVar174._40_4_ | (uint)!bVar7 * auVar82._40_4_;
            bVar7 = (bool)(bVar31 >> 3 & 1);
            auVar104._44_4_ = (uint)bVar7 * auVar174._44_4_ | (uint)!bVar7 * auVar82._44_4_;
            bVar7 = (bool)(bVar31 >> 4 & 1);
            auVar104._48_4_ = (uint)bVar7 * auVar174._48_4_ | (uint)!bVar7 * auVar82._48_4_;
            bVar7 = (bool)(bVar31 >> 5 & 1);
            auVar104._52_4_ = (uint)bVar7 * auVar174._52_4_ | (uint)!bVar7 * auVar82._52_4_;
            bVar7 = (bool)(bVar31 >> 6 & 1);
            auVar104._56_4_ = (uint)bVar7 * auVar174._56_4_ | (uint)!bVar7 * auVar82._56_4_;
            auVar104._60_4_ =
                 (uint)(bVar31 >> 7) * auVar174._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar82._60_4_
            ;
            auVar64 = vextractf64x4_avx512f(auVar104,1);
            auVar174 = vaddps_avx512f(auVar104,ZEXT3264(auVar64));
            auVar55 = vextractf32x4_avx512vl(auVar174._0_32_,1);
            auVar56 = vaddps_avx512vl(auVar174._0_16_,auVar55);
            auVar55 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar55);
            auVar56 = vhaddps_avx(auVar56,auVar56);
            fVar128 = auVar56._0_4_;
          }
          if (iVar36 == 8) {
            auVar64 = vextractf64x4_avx512f(auVar173,1);
            auVar65 = vaddps_avx512vl(auVar173._0_32_,auVar65);
            auVar65 = vaddps_avx512vl(auVar65,auVar64);
            auVar64 = vmulps_avx512vl(auVar65,auVar66._0_32_);
            in_ZMM16 = ZEXT3264(auVar64);
          }
          else {
            auVar55 = vxorps_avx512vl(auVar55,auVar55);
            in_ZMM16 = ZEXT1664(auVar55);
            if (iVar36 == 0x10) {
              in_ZMM16 = vmulps_avx512f(auVar173,auVar66);
            }
          }
          if (iVar36 == 4) {
            auVar64 = vextractf64x4_avx512f(auVar173,1);
            auVar65 = vaddps_avx512vl(auVar173._0_32_,auVar65);
            auVar65 = vaddps_avx512vl(auVar65,auVar64);
            auVar55 = vextractf32x4_avx512vl(auVar65,1);
            auVar55 = vaddps_avx512vl(auVar65._0_16_,auVar55);
            auVar54 = vaddps_avx512vl(auVar55,auVar54);
            auVar57 = vmulps_avx512vl(auVar54,auVar66._0_16_);
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar57,0);
          }
          if (iVar36 == 1) {
            auVar64 = vextractf64x4_avx512f(auVar173,1);
            auVar173 = vaddps_avx512f(auVar173,ZEXT3264(auVar64));
            auVar106._16_48_ = auVar173._16_48_;
            auVar55 = vextractf32x4_avx512vl(auVar173._0_32_,1);
            auVar55 = vaddps_avx512vl(auVar173._0_16_,auVar55);
            auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar55 = vaddps_avx512vl(auVar55,auVar57);
            auVar55 = vhaddps_avx(auVar55,auVar55);
            auVar56 = vextractf32x4_avx512vl(auVar65,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar65._0_16_);
            auVar58 = vshufps_avx512vl(auVar56,auVar54,0x11);
            auVar56 = vshufps_avx512vl(auVar56,auVar54,0xbb);
            auVar56 = vaddps_avx512vl(auVar56,auVar58);
            auVar58 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar58);
            auVar56 = vhaddps_avx(auVar56,auVar56);
            auVar106._0_16_ = in_ZMM16._0_16_;
            auVar105._4_60_ = auVar106._4_60_;
            auVar105._0_4_ = (fVar128 + auVar55._0_4_ + auVar56._0_4_) * fVar120;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar105._0_16_,0);
          }
          in_ZMM18 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
          auVar56 = in_ZMM16._0_16_;
          auVar55 = auVar56;
          if (iVar36 != 4) {
            auVar55 = vbroadcastss_avx512vl(auVar56);
          }
          auVar65 = in_ZMM16._0_32_;
          if (iVar36 != 8) {
            auVar65 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar55,1);
          }
          auVar173 = in_ZMM16;
          if (iVar36 != 0x10) {
            auVar173 = vinsertf64x4_avx512f(ZEXT3264(auVar65),auVar65,1);
          }
          auVar119 = auVar173._16_48_;
          pauVar37 = pauVar49;
          if ((int)uVar47 < 0x10) {
            auVar54 = vxorps_avx512vl(auVar54,auVar54);
            in_ZMM19 = ZEXT1664(auVar54);
            uVar51 = 0;
          }
          else {
            auVar54 = vxorps_avx512vl(auVar54,auVar54);
            in_ZMM19 = ZEXT1664(auVar54);
            iVar38 = 0x10;
            do {
              auVar174 = vsubps_avx512f(*pauVar37,auVar173);
              in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar174,auVar174);
              auVar119 = in_ZMM19._16_48_;
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar51 = uVar45;
            } while (iVar38 <= (int)uVar47);
          }
          uVar39 = uVar51 | 8;
          auVar107._0_16_ = vxorps_avx512vl(auVar57,auVar57);
          auVar107._16_48_ = auVar119;
          in_ZMM20 = ZEXT1664(auVar107._0_16_);
          while ((int)uVar39 <= (int)uVar47) {
            auVar64 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar65);
            auVar107._0_32_ = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar64,auVar64);
            auVar119 = auVar107._16_48_;
            in_ZMM20 = ZEXT3264(auVar107._0_32_);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar51 + 0x10;
            uVar51 = uVar51 + 8;
          }
          iVar38 = uVar51 + 4;
          auVar54 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
          while (iVar38 <= (int)uVar47) {
            auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar55);
            auVar54 = vfmadd231ps_avx512vl(auVar54,auVar57,auVar57);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar51 + 8;
            uVar51 = uVar51 + 4;
          }
          fVar128 = 0.0;
          if ((int)uVar51 < (int)uVar47) {
            auVar173 = vpbroadcastq_avx512f();
            auVar174 = vbroadcastss_avx512f(auVar56);
            auVar55 = auVar174._0_16_;
            auVar57 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
            uVar42 = 0;
            in_ZMM24 = ZEXT1664(auVar57);
            do {
              auVar82 = in_ZMM24;
              auVar72 = vpbroadcastq_avx512f();
              auVar73 = vporq_avx512f(auVar72,auVar67);
              auVar72 = vporq_avx512f(auVar72,auVar68);
              uVar20 = vpcmpuq_avx512f(auVar72,auVar173,2);
              bVar30 = (byte)uVar20;
              uVar20 = vpcmpuq_avx512f(auVar73,auVar173,2);
              bVar31 = (byte)uVar20;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar42 * 4);
              auVar108._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar108._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar108._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar108._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar108._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar108._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar108._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar108._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar108._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar108._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar108._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar108._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar108._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar108._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar108._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar108._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar72 = vsubps_avx512f(auVar108,auVar174);
              in_ZMM24 = vfmadd213ps_avx512f(auVar72,auVar72,auVar82);
              uVar42 = uVar42 + 0x10;
            } while (((ulong)(~uVar51 + uVar47) + 0x10 & 0x1fffffff0) != uVar42);
            auVar109._0_4_ =
                 (uint)(bVar30 & 1) * in_ZMM24._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar82._0_4_;
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            auVar109._4_4_ = (uint)bVar7 * in_ZMM24._4_4_ | (uint)!bVar7 * auVar82._4_4_;
            bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
            auVar109._8_4_ = (uint)bVar7 * in_ZMM24._8_4_ | (uint)!bVar7 * auVar82._8_4_;
            bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
            auVar109._12_4_ = (uint)bVar7 * in_ZMM24._12_4_ | (uint)!bVar7 * auVar82._12_4_;
            bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
            auVar109._16_4_ = (uint)bVar7 * in_ZMM24._16_4_ | (uint)!bVar7 * auVar82._16_4_;
            bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
            auVar109._20_4_ = (uint)bVar7 * in_ZMM24._20_4_ | (uint)!bVar7 * auVar82._20_4_;
            bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
            auVar109._24_4_ = (uint)bVar7 * in_ZMM24._24_4_ | (uint)!bVar7 * auVar82._24_4_;
            bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
            auVar109._28_4_ = (uint)bVar7 * in_ZMM24._28_4_ | (uint)!bVar7 * auVar82._28_4_;
            auVar109._32_4_ =
                 (uint)(bVar31 & 1) * in_ZMM24._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar82._32_4_;
            bVar7 = (bool)(bVar31 >> 1 & 1);
            auVar109._36_4_ = (uint)bVar7 * in_ZMM24._36_4_ | (uint)!bVar7 * auVar82._36_4_;
            bVar7 = (bool)(bVar31 >> 2 & 1);
            auVar109._40_4_ = (uint)bVar7 * in_ZMM24._40_4_ | (uint)!bVar7 * auVar82._40_4_;
            bVar7 = (bool)(bVar31 >> 3 & 1);
            auVar109._44_4_ = (uint)bVar7 * in_ZMM24._44_4_ | (uint)!bVar7 * auVar82._44_4_;
            bVar7 = (bool)(bVar31 >> 4 & 1);
            auVar109._48_4_ = (uint)bVar7 * in_ZMM24._48_4_ | (uint)!bVar7 * auVar82._48_4_;
            bVar7 = (bool)(bVar31 >> 5 & 1);
            auVar109._52_4_ = (uint)bVar7 * in_ZMM24._52_4_ | (uint)!bVar7 * auVar82._52_4_;
            bVar7 = (bool)(bVar31 >> 6 & 1);
            auVar109._56_4_ = (uint)bVar7 * in_ZMM24._56_4_ | (uint)!bVar7 * auVar82._56_4_;
            auVar109._60_4_ =
                 (uint)(bVar31 >> 7) * in_ZMM24._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar82._60_4_
            ;
            auVar65 = vextractf64x4_avx512f(auVar109,1);
            auVar173 = vaddps_avx512f(auVar109,ZEXT3264(auVar65));
            auVar119 = auVar173._16_48_;
            auVar151._0_4_ = auVar173._0_4_ + auVar173._16_4_;
            auVar151._4_4_ = auVar173._4_4_ + auVar173._20_4_;
            auVar151._8_4_ = auVar173._8_4_ + auVar173._24_4_;
            auVar151._12_4_ = auVar173._12_4_ + auVar173._28_4_;
            auVar57 = vshufpd_avx(auVar151,auVar151,1);
            auVar152._0_4_ = auVar151._0_4_ + auVar57._0_4_;
            auVar152._4_4_ = auVar151._4_4_ + auVar57._4_4_;
            auVar152._8_4_ = auVar151._8_4_ + auVar57._8_4_;
            auVar152._12_4_ = auVar151._12_4_ + auVar57._12_4_;
            auVar57 = vhaddps_avx(auVar152,auVar152);
            fVar128 = auVar57._0_4_;
          }
          auVar55 = vxorps_avx512vl(auVar55,auVar55);
          in_ZMM17 = ZEXT1664(auVar55);
          if (iVar36 == 0x10) {
            in_ZMM17 = vmulps_avx512f(in_ZMM19,auVar66);
            auVar119 = in_ZMM17._16_48_;
          }
          if (iVar36 == 8) {
            auVar65 = vextractf64x4_avx512f(in_ZMM19,1);
            auVar64 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
            auVar65 = vaddps_avx512vl(auVar64,auVar65);
            in_ZMM20 = ZEXT3264(auVar65);
            auVar65 = vmulps_avx512vl(auVar65,auVar66._0_32_);
            in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar65,0);
            auVar119 = in_ZMM17._16_48_;
          }
          if (iVar36 == 4) {
            auVar65 = vextractf64x4_avx512f(in_ZMM19,1);
            auVar64 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
            auVar65 = vaddps_avx512vl(auVar64,auVar65);
            in_ZMM20 = ZEXT3264(auVar65);
            auVar55 = vextractf32x4_avx512vl(auVar65,1);
            auVar55 = vaddps_avx512vl(auVar65._0_16_,auVar55);
            auVar54 = vaddps_avx512vl(auVar55,auVar54);
            auVar55 = vmulps_avx512vl(auVar54,auVar66._0_16_);
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar55,0);
            auVar119 = in_ZMM17._16_48_;
          }
          if (iVar36 == 1) {
            auVar65 = vextractf64x4_avx512f(in_ZMM19,1);
            auVar173 = vaddps_avx512f(in_ZMM19,ZEXT3264(auVar65));
            auVar111._16_48_ = auVar173._16_48_;
            auVar55 = vextractf32x4_avx512vl(auVar173._0_32_,1);
            auVar55 = vaddps_avx512vl(auVar173._0_16_,auVar55);
            auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar55 = vaddps_avx512vl(auVar55,auVar57);
            auVar55 = vhaddps_avx(auVar55,auVar55);
            auVar57 = vextractf32x4_avx512vl(in_ZMM20._0_32_,1);
            auVar57 = vaddps_avx512vl(auVar57,in_ZMM20._0_16_);
            auVar58 = vshufps_avx512vl(auVar57,auVar54,0x11);
            auVar54 = vshufps_avx512vl(auVar57,auVar54,0xbb);
            auVar54 = vaddps_avx512vl(auVar54,auVar58);
            auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
            in_ZMM19 = ZEXT1664(auVar57);
            auVar54 = vaddps_avx512vl(auVar54,auVar57);
            auVar54 = vhaddps_avx(auVar54,auVar54);
            auVar111._0_16_ = in_ZMM17._0_16_;
            auVar110._4_60_ = auVar111._4_60_;
            auVar110._0_4_ = (fVar128 + auVar55._0_4_ + auVar54._0_4_) * fVar120;
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar110._0_16_,0);
            auVar119 = in_ZMM17._16_48_;
          }
          auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
          if (iVar36 < 8) {
            auVar55 = in_ZMM17._0_16_;
            if (iVar36 == 1) {
              auVar57 = vaddss_avx512f(auVar55,auVar54);
              auVar54 = vrsqrtss_avx(auVar57,auVar57);
              auVar57 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar54._0_4_)),auVar54,
                                            ZEXT416(0xc0400000));
              auVar54 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
              fVar128 = auVar54._0_4_ * auVar57._0_4_;
              auVar113._16_48_ = auVar119;
              auVar113._0_16_ = auVar55;
              auVar112._4_60_ = auVar113._4_60_;
              auVar112._0_4_ = fVar128;
              in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar112._0_16_,0);
              auVar115._16_48_ = in_ZMM17._16_48_;
              auVar54 = vxorps_avx512vl(auVar56,auVar165);
              auVar115._0_16_ = auVar56;
              auVar114._4_60_ = auVar115._4_60_;
              auVar114._0_4_ = fVar128 * auVar54._0_4_;
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar114._0_16_,0);
            }
            else if (iVar36 == 4) {
              auVar54 = vbroadcastss_avx512vl(auVar54);
              auVar55 = vaddps_avx512vl(auVar55,auVar54);
              auVar54 = vrsqrtps_avx(auVar55);
              auVar153._0_4_ = auVar55._0_4_ * auVar54._0_4_;
              auVar153._4_4_ = auVar55._4_4_ * auVar54._4_4_;
              auVar153._8_4_ = auVar55._8_4_ * auVar54._8_4_;
              auVar153._12_4_ = auVar55._12_4_ * auVar54._12_4_;
              auVar55 = vfmadd213ps_fma(auVar153,auVar54,auVar168);
              auVar154._0_4_ = auVar54._0_4_ * -0.5 * auVar55._0_4_;
              auVar154._4_4_ = auVar54._4_4_ * -0.5 * auVar55._4_4_;
              auVar154._8_4_ = auVar54._8_4_ * -0.5 * auVar55._8_4_;
              auVar154._12_4_ = auVar54._12_4_ * -0.5 * auVar55._12_4_;
              auVar54 = vxorps_avx512vl(auVar56,auVar165);
              auVar162._0_4_ = auVar154._0_4_ * auVar54._0_4_;
              auVar162._4_4_ = auVar154._4_4_ * auVar54._4_4_;
              auVar162._8_4_ = auVar154._8_4_ * auVar54._8_4_;
              auVar162._12_4_ = auVar154._12_4_ * auVar54._12_4_;
              in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar154,0);
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar162,0);
            }
          }
          else if (iVar36 == 8) {
            auVar65 = vbroadcastss_avx512vl(auVar54);
            auVar64 = vaddps_avx512vl(in_ZMM17._0_32_,auVar65);
            auVar65 = vrsqrtps_avx(auVar64);
            auVar34._4_4_ = auVar64._4_4_ * auVar65._4_4_;
            auVar34._0_4_ = auVar64._0_4_ * auVar65._0_4_;
            auVar34._8_4_ = auVar64._8_4_ * auVar65._8_4_;
            auVar34._12_4_ = auVar64._12_4_ * auVar65._12_4_;
            auVar34._16_4_ = auVar64._16_4_ * auVar65._16_4_;
            auVar34._20_4_ = auVar64._20_4_ * auVar65._20_4_;
            auVar34._24_4_ = auVar64._24_4_ * auVar65._24_4_;
            auVar34._28_4_ = auVar64._28_4_;
            auVar54 = vfmadd213ps_fma(auVar34,auVar65,auVar170);
            auVar158._0_4_ = auVar65._0_4_ * -0.5 * auVar54._0_4_;
            auVar158._4_4_ = auVar65._4_4_ * -0.5 * auVar54._4_4_;
            auVar158._8_4_ = auVar65._8_4_ * -0.5 * auVar54._8_4_;
            auVar158._12_4_ = auVar65._12_4_ * -0.5 * auVar54._12_4_;
            auVar158._16_4_ = auVar65._16_4_ * -0.5 * 0.0;
            auVar158._20_4_ = auVar65._20_4_ * -0.5 * 0.0;
            auVar158._24_4_ = auVar65._24_4_ * -0.5 * 0.0;
            auVar158._28_4_ = 0;
            auVar65 = vxorps_avx512vl(in_ZMM16._0_32_,auVar172);
            auVar35._4_4_ = auVar158._4_4_ * auVar65._4_4_;
            auVar35._0_4_ = auVar158._0_4_ * auVar65._0_4_;
            auVar35._8_4_ = auVar158._8_4_ * auVar65._8_4_;
            auVar35._12_4_ = auVar158._12_4_ * auVar65._12_4_;
            auVar35._16_4_ = auVar158._16_4_ * auVar65._16_4_;
            auVar35._20_4_ = auVar158._20_4_ * auVar65._20_4_;
            auVar35._24_4_ = auVar158._24_4_ * auVar65._24_4_;
            auVar35._28_4_ = auVar65._28_4_;
            in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar158,0);
            in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar35,0);
          }
          else if (iVar36 == 0x10) {
            auVar173 = vbroadcastss_avx512f(auVar54);
            auVar173 = vaddps_avx512f(in_ZMM17,auVar173);
            auVar174 = vrsqrt14ps_avx512f(auVar173);
            auVar173 = vmulps_avx512f(auVar173,auVar174);
            auVar173 = vfmadd213ps_avx512f(auVar173,auVar174,auVar69);
            auVar174 = vmulps_avx512f(auVar174,auVar70);
            in_ZMM17 = vmulps_avx512f(auVar174,auVar173);
            auVar173 = vxorps_avx512dq(in_ZMM16,auVar71);
            in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar173);
          }
          auVar55 = in_ZMM17._0_16_;
          auVar65 = in_ZMM17._0_32_;
          auVar54 = in_ZMM16._0_16_;
          auVar64 = in_ZMM16._0_32_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
            auVar57 = auVar55;
            if (iVar36 != 4) {
              auVar57 = vbroadcastss_avx512vl(auVar55);
            }
            in_ZMM18 = ZEXT1664(auVar57);
            auVar56 = auVar54;
            if (iVar36 != 4) {
              auVar56 = vbroadcastss_avx512vl(auVar54);
            }
            in_ZMM19 = ZEXT1664(auVar56);
            if (iVar36 != 8) {
              auVar65 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
            }
            in_ZMM20 = ZEXT3264(auVar65);
            if (iVar36 != 8) {
              auVar64 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
            }
            auVar173 = in_ZMM16;
            auVar174 = in_ZMM17;
            if (iVar36 != 0x10) {
              auVar174 = vinsertf64x4_avx512f(in_ZMM20,auVar65,1);
              auVar173 = vinsertf64x4_avx512f(ZEXT3264(auVar64),auVar64,1);
            }
            uVar51 = 0;
            if (0xf < (int)uVar47) {
              iVar38 = 0x10;
              do {
                auVar72 = vfmadd132ps_avx512f(*pauVar49,auVar173,auVar174);
                *pauVar49 = auVar72;
                pauVar49 = pauVar49 + 1;
                iVar38 = iVar38 + 0x10;
                uVar51 = uVar45;
              } while (iVar38 <= (int)uVar47);
            }
            uVar39 = uVar51 | 8;
            while ((int)uVar39 <= (int)uVar47) {
              auVar60 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar64,auVar65);
              *(undefined1 (*) [32])*pauVar49 = auVar60;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              uVar39 = uVar51 + 0x10;
              uVar51 = uVar51 + 8;
            }
            iVar38 = uVar51 + 4;
            while (iVar38 <= (int)uVar47) {
              auVar58 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar56,auVar57);
              *(undefined1 (*) [16])*pauVar49 = auVar58;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              iVar38 = uVar51 + 8;
              uVar51 = uVar51 + 4;
            }
            if ((int)uVar51 < (int)uVar47) {
              auVar173 = vpbroadcastq_avx512f();
              in_ZMM17 = vbroadcastss_avx512f(auVar55);
              in_ZMM16 = vbroadcastss_avx512f(auVar54);
              uVar42 = 0;
              do {
                auVar174 = vpbroadcastq_avx512f();
                in_ZMM18 = vporq_avx512f(auVar174,auVar67);
                auVar174 = vporq_avx512f(auVar174,auVar68);
                uVar20 = vpcmpuq_avx512f(auVar174,auVar173,2);
                bVar30 = (byte)uVar20;
                uVar20 = vpcmpuq_avx512f(in_ZMM18,auVar173,2);
                bVar31 = (byte)uVar20;
                uVar53 = CONCAT11(bVar31,bVar30);
                piVar1 = (int *)(*pauVar49 + uVar42 * 4);
                auVar117._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                auVar117._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                auVar117._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                auVar117._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                auVar117._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                auVar117._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                auVar117._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                auVar117._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                auVar117._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                auVar117._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                auVar117._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                auVar117._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                auVar117._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                auVar117._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                auVar117._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                auVar117._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                auVar72 = vfmadd213ps_avx512f(auVar117,in_ZMM17,in_ZMM16);
                auVar174 = *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4);
                auVar118._0_4_ =
                     (uint)(bVar30 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar174._0_4_
                ;
                bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                auVar118._4_4_ = (uint)bVar7 * auVar72._4_4_ | (uint)!bVar7 * auVar174._4_4_;
                bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                auVar118._8_4_ = (uint)bVar7 * auVar72._8_4_ | (uint)!bVar7 * auVar174._8_4_;
                bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                auVar118._12_4_ = (uint)bVar7 * auVar72._12_4_ | (uint)!bVar7 * auVar174._12_4_;
                bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                auVar118._16_4_ = (uint)bVar7 * auVar72._16_4_ | (uint)!bVar7 * auVar174._16_4_;
                bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                auVar118._20_4_ = (uint)bVar7 * auVar72._20_4_ | (uint)!bVar7 * auVar174._20_4_;
                bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                auVar118._24_4_ = (uint)bVar7 * auVar72._24_4_ | (uint)!bVar7 * auVar174._24_4_;
                bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                auVar118._28_4_ = (uint)bVar7 * auVar72._28_4_ | (uint)!bVar7 * auVar174._28_4_;
                auVar118._32_4_ =
                     (uint)(bVar31 & 1) * auVar72._32_4_ |
                     (uint)!(bool)(bVar31 & 1) * auVar174._32_4_;
                bVar7 = (bool)(bVar31 >> 1 & 1);
                auVar118._36_4_ = (uint)bVar7 * auVar72._36_4_ | (uint)!bVar7 * auVar174._36_4_;
                bVar7 = (bool)(bVar31 >> 2 & 1);
                auVar118._40_4_ = (uint)bVar7 * auVar72._40_4_ | (uint)!bVar7 * auVar174._40_4_;
                bVar7 = (bool)(bVar31 >> 3 & 1);
                auVar118._44_4_ = (uint)bVar7 * auVar72._44_4_ | (uint)!bVar7 * auVar174._44_4_;
                bVar7 = (bool)(bVar31 >> 4 & 1);
                auVar118._48_4_ = (uint)bVar7 * auVar72._48_4_ | (uint)!bVar7 * auVar174._48_4_;
                bVar7 = (bool)(bVar31 >> 5 & 1);
                auVar118._52_4_ = (uint)bVar7 * auVar72._52_4_ | (uint)!bVar7 * auVar174._52_4_;
                bVar7 = (bool)(bVar31 >> 6 & 1);
                auVar118._56_4_ = (uint)bVar7 * auVar72._56_4_ | (uint)!bVar7 * auVar174._56_4_;
                auVar118._60_4_ =
                     (uint)(bVar31 >> 7) * auVar72._60_4_ |
                     (uint)!(bool)(bVar31 >> 7) * auVar174._60_4_;
                *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4) = auVar118;
                uVar42 = uVar42 + 0x10;
              } while (((ulong)(~uVar51 + uVar47) + 0x10 & 0x1fffffff0) != uVar42);
            }
          }
          else {
            pauVar37 = pauVar50;
            pauVar41 = pauVar43;
            if (0xf < (int)uVar47 && iVar36 == 0x10) {
              iVar38 = 0x10;
              do {
                auVar173 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar41));
                auVar174 = vfmadd132ps_avx512f(*pauVar49,in_ZMM16,in_ZMM17);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar28._4_4_ = uVar3;
                auVar28._0_4_ = uVar3;
                auVar28._8_4_ = uVar3;
                auVar28._12_4_ = uVar3;
                auVar28._16_4_ = uVar3;
                auVar28._20_4_ = uVar3;
                auVar28._24_4_ = uVar3;
                auVar28._28_4_ = uVar3;
                auVar28._32_4_ = uVar3;
                auVar28._36_4_ = uVar3;
                auVar28._40_4_ = uVar3;
                auVar28._44_4_ = uVar3;
                auVar28._48_4_ = uVar3;
                auVar28._52_4_ = uVar3;
                auVar28._56_4_ = uVar3;
                auVar28._60_4_ = uVar3;
                auVar173 = vfmadd213ps_avx512f(auVar174,auVar173,auVar28);
                *pauVar49 = auVar173;
                pauVar49 = pauVar49 + 1;
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                iVar38 = iVar38 + 0x10;
              } while (iVar38 <= (int)uVar47);
            }
            if (iVar36 == 8) {
              uVar51 = 8;
              if (0xf < (int)uVar47) {
                auVar173 = vinsertf64x4_avx512f(in_ZMM17,auVar65,1);
                in_ZMM18 = vinsertf64x4_avx512f(in_ZMM16,auVar64,1);
                iVar38 = 0x10;
                do {
                  auVar174 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar41),auVar122,
                                               ZEXT464(*(uint *)(*pauVar41 + 4)));
                  in_ZMM20 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar122,
                                               ZEXT464(*(uint *)(*pauVar37 + 4)));
                  auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar173);
                  in_ZMM19 = vfmadd213ps_avx512f(auVar72,auVar174,in_ZMM20);
                  *pauVar49 = in_ZMM19;
                  pauVar49 = pauVar49 + 1;
                  pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  iVar38 = iVar38 + 0x10;
                  uVar51 = uVar47 | 8;
                } while (iVar38 <= (int)uVar47);
              }
              for (; (int)uVar51 <= (int)uVar47; uVar51 = uVar51 + 8) {
                uVar3 = *(undefined4 *)*pauVar41;
                auVar159._4_4_ = uVar3;
                auVar159._0_4_ = uVar3;
                auVar159._8_4_ = uVar3;
                auVar159._12_4_ = uVar3;
                auVar159._16_4_ = uVar3;
                auVar159._20_4_ = uVar3;
                auVar159._24_4_ = uVar3;
                auVar159._28_4_ = uVar3;
                auVar60 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar64,auVar65);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar26._4_4_ = uVar3;
                auVar26._0_4_ = uVar3;
                auVar26._8_4_ = uVar3;
                auVar26._12_4_ = uVar3;
                auVar26._16_4_ = uVar3;
                auVar26._20_4_ = uVar3;
                auVar26._24_4_ = uVar3;
                auVar26._28_4_ = uVar3;
                auVar60 = vfmadd213ps_avx512vl(auVar60,auVar159,auVar26);
                *(undefined1 (*) [32])*pauVar49 = auVar60;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (iVar36 == 4) {
              uVar51 = 0;
              if (0xf < (int)uVar47) {
                auVar173 = vinsertf64x4_avx512f(in_ZMM17,auVar65,1);
                auVar173 = vpermpd_avx512f(auVar173,0x44);
                auVar174 = vinsertf64x4_avx512f(in_ZMM16,auVar64,1);
                in_ZMM18 = vpermpd_avx512f(auVar174,0x44);
                iVar38 = 0x10;
                do {
                  auVar174 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 8)));
                  auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 0xc)));
                  auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                             ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                  auVar60 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                  auVar174 = vinsertf64x4_avx512f(auVar174,auVar60,0);
                  auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                  auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                  auVar116._0_48_ = auVar174._0_48_;
                  auVar116._48_8_ = auVar72._48_8_;
                  auVar116._56_8_ = auVar72._56_8_;
                  auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar60 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                  auVar174 = vinsertf64x4_avx512f(auVar73,auVar60,0);
                  in_ZMM19._0_48_ = auVar174._0_48_;
                  in_ZMM19._48_8_ = auVar82._48_8_;
                  in_ZMM19._56_8_ = auVar82._56_8_;
                  auVar174 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar173);
                  in_ZMM20 = vfmadd213ps_avx512f(auVar174,auVar116,in_ZMM19);
                  *pauVar49 = in_ZMM20;
                  pauVar49 = pauVar49 + 1;
                  pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = iVar38 + 0x10;
                  uVar51 = uVar45;
                } while (iVar38 <= (int)uVar47);
              }
              if ((int)(uVar51 | 8) <= (int)uVar47) {
                auVar65 = vpermpd_avx512vl(auVar65,0x44);
                auVar64 = vpermpd_avx512vl(auVar64,0x44);
                in_ZMM18 = ZEXT3264(auVar64);
                uVar39 = uVar51;
                do {
                  auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                             ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                  auVar56 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar60 = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                  auVar59 = vpermpd_avx512vl(ZEXT1632(auVar56),0x50);
                  in_ZMM19 = ZEXT3264(auVar59);
                  auVar61 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar64,auVar65);
                  auVar60 = vfmadd213ps_avx512vl(auVar61,auVar60,auVar59);
                  in_ZMM20 = ZEXT3264(auVar60);
                  *(undefined1 (*) [32])*pauVar49 = auVar60;
                  pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                  pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  uVar51 = uVar39 + 8;
                  iVar38 = uVar39 + 0x10;
                  uVar39 = uVar51;
                } while (iVar38 <= (int)uVar47);
              }
              while (uVar51 = uVar51 + 4, (int)uVar51 <= (int)uVar47) {
                uVar3 = *(undefined4 *)*pauVar41;
                auVar155._4_4_ = uVar3;
                auVar155._0_4_ = uVar3;
                auVar155._8_4_ = uVar3;
                auVar155._12_4_ = uVar3;
                auVar57 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar54,auVar55);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar22._4_4_ = uVar3;
                auVar22._0_4_ = uVar3;
                auVar22._8_4_ = uVar3;
                auVar22._12_4_ = uVar3;
                auVar57 = vfmadd213ps_avx512vl(auVar57,auVar155,auVar22);
                *(undefined1 (*) [16])*pauVar49 = auVar57;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (iVar36 == 1) {
              in_ZMM18 = vbroadcastss_avx512f(auVar55);
              in_ZMM19 = vbroadcastss_avx512f(auVar54);
              uVar51 = 0;
              if (0xf < (int)uVar47) {
                iVar38 = 0x10;
                do {
                  auVar173 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,in_ZMM18);
                  auVar173 = vfmadd213ps_avx512f(auVar173,*pauVar41,*pauVar37);
                  *pauVar49 = auVar173;
                  pauVar49 = pauVar49 + 1;
                  pauVar41 = pauVar41 + 1;
                  pauVar37 = pauVar37 + 1;
                  iVar38 = iVar38 + 0x10;
                  uVar51 = uVar45;
                } while (iVar38 <= (int)uVar47);
              }
              uVar39 = uVar51 | 8;
              while ((int)uVar39 <= (int)uVar47) {
                auVar65 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])*pauVar49,in_ZMM19._0_32_,in_ZMM18._0_32_
                                    );
                auVar57 = vfmadd213ps_fma(auVar65,*(undefined1 (*) [32])*pauVar41,
                                          *(undefined1 (*) [32])*pauVar37);
                *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar57);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                uVar39 = uVar51 + 0x10;
                uVar51 = uVar51 + 8;
              }
              iVar38 = uVar51 + 4;
              while (iVar38 <= (int)uVar47) {
                auVar57 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])*pauVar49,in_ZMM19._0_16_,in_ZMM18._0_16_
                                    );
                auVar57 = vfmadd213ps_fma(auVar57,*(undefined1 (*) [16])*pauVar41,
                                          *(undefined1 (*) [16])*pauVar37);
                *(undefined1 (*) [16])*pauVar49 = auVar57;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                iVar38 = uVar51 + 8;
                uVar51 = uVar51 + 4;
              }
              if (uVar47 - uVar51 != 0 && (int)uVar51 <= (int)uVar47) {
                lVar52 = 0;
                do {
                  auVar57 = vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),auVar54,
                                                auVar55);
                  auVar57 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar41 + lVar52 * 4)),auVar57,
                                            ZEXT416(*(uint *)(*pauVar37 + lVar52 * 4)));
                  *(int *)(*pauVar49 + lVar52 * 4) = auVar57._0_4_;
                  lVar52 = lVar52 + 1;
                } while (uVar47 - uVar51 != (int)lVar52);
              }
            }
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != uVar44);
      }
    }
    else if ((iVar38 == 2) && (0 < (int)uVar45)) {
      uVar44 = iVar4 * iVar36;
      fVar120 = 1.0 / (float)iVar4;
      auVar66 = vbroadcastss_avx512f(ZEXT416((uint)fVar120));
      uVar47 = uVar44 & 0xfffffff0;
      uVar48 = 0;
      auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar163._8_4_ = 0x80000000;
      auVar163._0_8_ = 0x8000000080000000;
      auVar163._12_4_ = 0x80000000;
      auVar166._8_4_ = 0xc0400000;
      auVar166._0_8_ = 0xc0400000c0400000;
      auVar166._12_4_ = 0xc0400000;
      auVar65._8_4_ = 0xc0400000;
      auVar65._0_8_ = 0xc0400000c0400000;
      auVar65._12_4_ = 0xc0400000;
      auVar65._16_4_ = 0xc0400000;
      auVar65._20_4_ = 0xc0400000;
      auVar65._24_4_ = 0xc0400000;
      auVar65._28_4_ = 0xc0400000;
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar64._16_4_ = 0x80000000;
      auVar64._20_4_ = 0x80000000;
      auVar64._24_4_ = 0x80000000;
      auVar64._28_4_ = 0x80000000;
      auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
      auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar71 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      do {
        auVar57 = in_ZMM20._0_16_;
        auVar55 = in_ZMM16._0_16_;
        pauVar49 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar48 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar173 = ZEXT1664(auVar54);
        pauVar37 = pauVar49;
        uVar51 = 0;
        if (0xf < (int)uVar44) {
          iVar38 = 0x10;
          do {
            auVar173 = vaddps_avx512f(auVar173,*pauVar37);
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar51 = uVar47;
          } while (iVar38 <= (int)uVar44);
        }
        uVar39 = uVar51 | 8;
        auVar54 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        auVar174 = ZEXT1664(auVar54);
        auVar60 = ZEXT1632(auVar54);
        while ((int)uVar39 <= (int)uVar44) {
          auVar60 = vaddps_avx512vl(auVar174._0_32_,*(undefined1 (*) [32])*pauVar37);
          auVar174 = ZEXT3264(auVar60);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar51 + 0x10;
          uVar51 = uVar51 + 8;
        }
        iVar38 = uVar51 + 4;
        auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        while (iVar38 <= (int)uVar44) {
          auVar54 = vaddps_avx512vl(auVar54,*(undefined1 (*) [16])*pauVar37);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar51 + 8;
          uVar51 = uVar51 + 4;
        }
        fVar128 = 0.0;
        if ((int)uVar51 < (int)uVar44) {
          auVar72 = vpbroadcastq_avx512f();
          auVar55 = vxorps_avx512vl(auVar57,auVar57);
          uVar42 = 0;
          auVar174 = ZEXT1664(auVar55);
          do {
            auVar82 = auVar174;
            auVar174 = vpbroadcastq_avx512f();
            auVar73 = vporq_avx512f(auVar174,auVar67);
            auVar174 = vporq_avx512f(auVar174,auVar68);
            uVar20 = vpcmpuq_avx512f(auVar174,auVar72,2);
            bVar30 = (byte)uVar20;
            uVar20 = vpcmpuq_avx512f(auVar73,auVar72,2);
            bVar31 = (byte)uVar20;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar42 * 4);
            auVar174._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar174._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar174._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar174._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar174._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar174._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar174._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar174._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar174._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar174._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar174._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar174._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar174._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar174._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar174._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar174._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar174 = vaddps_avx512f(auVar174,auVar82);
            auVar57 = auVar174._0_16_;
            uVar42 = uVar42 + 0x10;
          } while (((ulong)(~uVar51 + uVar44) + 0x10 & 0x1fffffff0) != uVar42);
          auVar72._0_4_ =
               (uint)(bVar30 & 1) * auVar174._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar82._0_4_;
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar72._4_4_ = (uint)bVar7 * auVar174._4_4_ | (uint)!bVar7 * auVar82._4_4_;
          bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar72._8_4_ = (uint)bVar7 * auVar174._8_4_ | (uint)!bVar7 * auVar82._8_4_;
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar72._12_4_ = (uint)bVar7 * auVar174._12_4_ | (uint)!bVar7 * auVar82._12_4_;
          bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar72._16_4_ = (uint)bVar7 * auVar174._16_4_ | (uint)!bVar7 * auVar82._16_4_;
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar72._20_4_ = (uint)bVar7 * auVar174._20_4_ | (uint)!bVar7 * auVar82._20_4_;
          bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar72._24_4_ = (uint)bVar7 * auVar174._24_4_ | (uint)!bVar7 * auVar82._24_4_;
          bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
          auVar72._28_4_ = (uint)bVar7 * auVar174._28_4_ | (uint)!bVar7 * auVar82._28_4_;
          auVar72._32_4_ =
               (uint)(bVar31 & 1) * auVar174._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar82._32_4_;
          bVar7 = (bool)(bVar31 >> 1 & 1);
          auVar72._36_4_ = (uint)bVar7 * auVar174._36_4_ | (uint)!bVar7 * auVar82._36_4_;
          bVar7 = (bool)(bVar31 >> 2 & 1);
          auVar72._40_4_ = (uint)bVar7 * auVar174._40_4_ | (uint)!bVar7 * auVar82._40_4_;
          bVar7 = (bool)(bVar31 >> 3 & 1);
          auVar72._44_4_ = (uint)bVar7 * auVar174._44_4_ | (uint)!bVar7 * auVar82._44_4_;
          bVar7 = (bool)(bVar31 >> 4 & 1);
          auVar72._48_4_ = (uint)bVar7 * auVar174._48_4_ | (uint)!bVar7 * auVar82._48_4_;
          bVar7 = (bool)(bVar31 >> 5 & 1);
          auVar72._52_4_ = (uint)bVar7 * auVar174._52_4_ | (uint)!bVar7 * auVar82._52_4_;
          bVar7 = (bool)(bVar31 >> 6 & 1);
          auVar72._56_4_ = (uint)bVar7 * auVar174._56_4_ | (uint)!bVar7 * auVar82._56_4_;
          auVar72._60_4_ =
               (uint)(bVar31 >> 7) * auVar174._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar82._60_4_;
          auVar59 = vextractf64x4_avx512f(auVar72,1);
          auVar174 = vaddps_avx512f(auVar72,ZEXT3264(auVar59));
          auVar55 = vextractf32x4_avx512vl(auVar174._0_32_,1);
          auVar56 = vaddps_avx512vl(auVar174._0_16_,auVar55);
          auVar55 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar56 = vaddps_avx512vl(auVar56,auVar55);
          auVar56 = vhaddps_avx(auVar56,auVar56);
          fVar128 = auVar56._0_4_;
        }
        if (iVar36 == 8) {
          auVar59 = vextractf64x4_avx512f(auVar173,1);
          auVar60 = vaddps_avx512vl(auVar173._0_32_,auVar60);
          auVar60 = vaddps_avx512vl(auVar60,auVar59);
          auVar59 = vmulps_avx512vl(auVar60,auVar66._0_32_);
          in_ZMM16 = ZEXT3264(auVar59);
        }
        else {
          auVar55 = vxorps_avx512vl(auVar55,auVar55);
          in_ZMM16 = ZEXT1664(auVar55);
          if (iVar36 == 0x10) {
            in_ZMM16 = vmulps_avx512f(auVar173,auVar66);
          }
        }
        if (iVar36 == 4) {
          auVar59 = vextractf64x4_avx512f(auVar173,1);
          auVar60 = vaddps_avx512vl(auVar173._0_32_,auVar60);
          auVar60 = vaddps_avx512vl(auVar60,auVar59);
          auVar55 = vextractf32x4_avx512vl(auVar60,1);
          auVar55 = vaddps_avx512vl(auVar60._0_16_,auVar55);
          auVar54 = vaddps_avx512vl(auVar55,auVar54);
          auVar57 = vmulps_avx512vl(auVar54,auVar66._0_16_);
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar57,0);
        }
        if (iVar36 == 1) {
          auVar59 = vextractf64x4_avx512f(auVar173,1);
          auVar173 = vaddps_avx512f(auVar173,ZEXT3264(auVar59));
          auVar55 = vextractf32x4_avx512vl(auVar173._0_32_,1);
          auVar55 = vaddps_avx512vl(auVar173._0_16_,auVar55);
          auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar55 = vaddps_avx512vl(auVar55,auVar57);
          auVar55 = vhaddps_avx(auVar55,auVar55);
          auVar56 = vextractf32x4_avx512vl(auVar60,1);
          auVar56 = vaddps_avx512vl(auVar56,auVar60._0_16_);
          auVar58 = vshufps_avx512vl(auVar56,auVar54,0x11);
          auVar56 = vshufps_avx512vl(auVar56,auVar54,0xbb);
          auVar56 = vaddps_avx512vl(auVar56,auVar58);
          auVar58 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar56 = vaddps_avx512vl(auVar56,auVar58);
          auVar56 = vhaddps_avx(auVar56,auVar56);
          auVar173._0_16_ = in_ZMM16._0_16_;
          auVar73._4_60_ = auVar173._4_60_;
          auVar73._0_4_ = (fVar128 + auVar55._0_4_ + auVar56._0_4_) * fVar120;
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar73._0_16_,0);
        }
        in_ZMM18 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
        auVar56 = in_ZMM16._0_16_;
        auVar55 = auVar56;
        if (iVar36 != 4) {
          auVar55 = vbroadcastss_avx512vl(auVar56);
        }
        auVar60 = in_ZMM16._0_32_;
        if (iVar36 != 8) {
          auVar60 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar55,1);
        }
        auVar173 = in_ZMM16;
        if (iVar36 != 0x10) {
          auVar173 = vinsertf64x4_avx512f(ZEXT3264(auVar60),auVar60,1);
        }
        auVar119 = auVar173._16_48_;
        pauVar37 = pauVar49;
        if ((int)uVar44 < 0x10) {
          auVar54 = vxorps_avx512vl(auVar54,auVar54);
          in_ZMM19 = ZEXT1664(auVar54);
          uVar51 = 0;
        }
        else {
          auVar54 = vxorps_avx512vl(auVar54,auVar54);
          in_ZMM19 = ZEXT1664(auVar54);
          iVar38 = 0x10;
          do {
            auVar174 = vsubps_avx512f(*pauVar37,auVar173);
            in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar174,auVar174);
            auVar119 = in_ZMM19._16_48_;
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar51 = uVar47;
          } while (iVar38 <= (int)uVar44);
        }
        uVar39 = uVar51 | 8;
        auVar82._0_16_ = vxorps_avx512vl(auVar57,auVar57);
        auVar82._16_48_ = auVar119;
        in_ZMM20 = ZEXT1664(auVar82._0_16_);
        while ((int)uVar39 <= (int)uVar44) {
          auVar59 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar60);
          auVar82._0_32_ = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar59,auVar59);
          auVar119 = auVar82._16_48_;
          in_ZMM20 = ZEXT3264(auVar82._0_32_);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar51 + 0x10;
          uVar51 = uVar51 + 8;
        }
        iVar38 = uVar51 + 4;
        auVar54 = vxorps_avx512vl(auVar60._0_16_,auVar60._0_16_);
        while (iVar38 <= (int)uVar44) {
          auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar55);
          auVar54 = vfmadd231ps_avx512vl(auVar54,auVar57,auVar57);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar51 + 8;
          uVar51 = uVar51 + 4;
        }
        fVar128 = 0.0;
        if ((int)uVar51 < (int)uVar44) {
          auVar173 = vpbroadcastq_avx512f();
          auVar174 = vbroadcastss_avx512f(auVar56);
          auVar55 = auVar174._0_16_;
          auVar57 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          uVar42 = 0;
          in_ZMM24 = ZEXT1664(auVar57);
          do {
            auVar82 = in_ZMM24;
            auVar72 = vpbroadcastq_avx512f();
            auVar73 = vporq_avx512f(auVar72,auVar67);
            auVar72 = vporq_avx512f(auVar72,auVar68);
            uVar20 = vpcmpuq_avx512f(auVar72,auVar173,2);
            bVar30 = (byte)uVar20;
            uVar20 = vpcmpuq_avx512f(auVar73,auVar173,2);
            bVar31 = (byte)uVar20;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar42 * 4);
            auVar74._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar74._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar74._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar74._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar74._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar74._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar74._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar74._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar74._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar74._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar74._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar74._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar74._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar74._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar74._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar74._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar72 = vsubps_avx512f(auVar74,auVar174);
            in_ZMM24 = vfmadd213ps_avx512f(auVar72,auVar72,auVar82);
            uVar42 = uVar42 + 0x10;
          } while (((ulong)(~uVar51 + uVar44) + 0x10 & 0x1fffffff0) != uVar42);
          auVar75._0_4_ =
               (uint)(bVar30 & 1) * in_ZMM24._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar82._0_4_;
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar75._4_4_ = (uint)bVar7 * in_ZMM24._4_4_ | (uint)!bVar7 * auVar82._4_4_;
          bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar75._8_4_ = (uint)bVar7 * in_ZMM24._8_4_ | (uint)!bVar7 * auVar82._8_4_;
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar75._12_4_ = (uint)bVar7 * in_ZMM24._12_4_ | (uint)!bVar7 * auVar82._12_4_;
          bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar75._16_4_ = (uint)bVar7 * in_ZMM24._16_4_ | (uint)!bVar7 * auVar82._16_4_;
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar75._20_4_ = (uint)bVar7 * in_ZMM24._20_4_ | (uint)!bVar7 * auVar82._20_4_;
          bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar75._24_4_ = (uint)bVar7 * in_ZMM24._24_4_ | (uint)!bVar7 * auVar82._24_4_;
          bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
          auVar75._28_4_ = (uint)bVar7 * in_ZMM24._28_4_ | (uint)!bVar7 * auVar82._28_4_;
          auVar75._32_4_ =
               (uint)(bVar31 & 1) * in_ZMM24._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar82._32_4_;
          bVar7 = (bool)(bVar31 >> 1 & 1);
          auVar75._36_4_ = (uint)bVar7 * in_ZMM24._36_4_ | (uint)!bVar7 * auVar82._36_4_;
          bVar7 = (bool)(bVar31 >> 2 & 1);
          auVar75._40_4_ = (uint)bVar7 * in_ZMM24._40_4_ | (uint)!bVar7 * auVar82._40_4_;
          bVar7 = (bool)(bVar31 >> 3 & 1);
          auVar75._44_4_ = (uint)bVar7 * in_ZMM24._44_4_ | (uint)!bVar7 * auVar82._44_4_;
          bVar7 = (bool)(bVar31 >> 4 & 1);
          auVar75._48_4_ = (uint)bVar7 * in_ZMM24._48_4_ | (uint)!bVar7 * auVar82._48_4_;
          bVar7 = (bool)(bVar31 >> 5 & 1);
          auVar75._52_4_ = (uint)bVar7 * in_ZMM24._52_4_ | (uint)!bVar7 * auVar82._52_4_;
          bVar7 = (bool)(bVar31 >> 6 & 1);
          auVar75._56_4_ = (uint)bVar7 * in_ZMM24._56_4_ | (uint)!bVar7 * auVar82._56_4_;
          auVar75._60_4_ =
               (uint)(bVar31 >> 7) * in_ZMM24._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar82._60_4_;
          auVar60 = vextractf64x4_avx512f(auVar75,1);
          auVar173 = vaddps_avx512f(auVar75,ZEXT3264(auVar60));
          auVar119 = auVar173._16_48_;
          auVar141._0_4_ = auVar173._0_4_ + auVar173._16_4_;
          auVar141._4_4_ = auVar173._4_4_ + auVar173._20_4_;
          auVar141._8_4_ = auVar173._8_4_ + auVar173._24_4_;
          auVar141._12_4_ = auVar173._12_4_ + auVar173._28_4_;
          auVar57 = vshufpd_avx(auVar141,auVar141,1);
          auVar142._0_4_ = auVar141._0_4_ + auVar57._0_4_;
          auVar142._4_4_ = auVar141._4_4_ + auVar57._4_4_;
          auVar142._8_4_ = auVar141._8_4_ + auVar57._8_4_;
          auVar142._12_4_ = auVar141._12_4_ + auVar57._12_4_;
          auVar57 = vhaddps_avx(auVar142,auVar142);
          fVar128 = auVar57._0_4_;
        }
        auVar55 = vxorps_avx512vl(auVar55,auVar55);
        in_ZMM17 = ZEXT1664(auVar55);
        if (iVar36 == 0x10) {
          in_ZMM17 = vmulps_avx512f(in_ZMM19,auVar66);
          auVar119 = in_ZMM17._16_48_;
        }
        if (iVar36 == 8) {
          auVar60 = vextractf64x4_avx512f(in_ZMM19,1);
          auVar59 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
          auVar60 = vaddps_avx512vl(auVar59,auVar60);
          in_ZMM20 = ZEXT3264(auVar60);
          auVar60 = vmulps_avx512vl(auVar60,auVar66._0_32_);
          in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar60,0);
          auVar119 = in_ZMM17._16_48_;
        }
        if (iVar36 == 4) {
          auVar60 = vextractf64x4_avx512f(in_ZMM19,1);
          auVar59 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
          auVar60 = vaddps_avx512vl(auVar59,auVar60);
          in_ZMM20 = ZEXT3264(auVar60);
          auVar55 = vextractf32x4_avx512vl(auVar60,1);
          auVar55 = vaddps_avx512vl(auVar60._0_16_,auVar55);
          auVar54 = vaddps_avx512vl(auVar55,auVar54);
          auVar55 = vmulps_avx512vl(auVar54,auVar66._0_16_);
          in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar55,0);
          auVar119 = in_ZMM17._16_48_;
        }
        if (iVar36 == 1) {
          auVar60 = vextractf64x4_avx512f(in_ZMM19,1);
          auVar173 = vaddps_avx512f(in_ZMM19,ZEXT3264(auVar60));
          auVar77._16_48_ = auVar173._16_48_;
          auVar55 = vextractf32x4_avx512vl(auVar173._0_32_,1);
          auVar55 = vaddps_avx512vl(auVar173._0_16_,auVar55);
          auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar55 = vaddps_avx512vl(auVar55,auVar57);
          auVar55 = vhaddps_avx(auVar55,auVar55);
          auVar57 = vextractf32x4_avx512vl(in_ZMM20._0_32_,1);
          auVar57 = vaddps_avx512vl(auVar57,in_ZMM20._0_16_);
          auVar58 = vshufps_avx512vl(auVar57,auVar54,0x11);
          auVar54 = vshufps_avx512vl(auVar57,auVar54,0xbb);
          auVar54 = vaddps_avx512vl(auVar54,auVar58);
          auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
          in_ZMM19 = ZEXT1664(auVar57);
          auVar54 = vaddps_avx512vl(auVar54,auVar57);
          auVar54 = vhaddps_avx(auVar54,auVar54);
          auVar77._0_16_ = in_ZMM17._0_16_;
          auVar76._4_60_ = auVar77._4_60_;
          auVar76._0_4_ = (fVar128 + auVar55._0_4_ + auVar54._0_4_) * fVar120;
          in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar76._0_16_,0);
          auVar119 = in_ZMM17._16_48_;
        }
        auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
        if (iVar36 < 8) {
          auVar55 = in_ZMM17._0_16_;
          if (iVar36 == 1) {
            auVar57 = vaddss_avx512f(auVar55,auVar54);
            auVar54 = vrsqrtss_avx(auVar57,auVar57);
            auVar57 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar54._0_4_)),auVar54,
                                          ZEXT416(0xc0400000));
            auVar54 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
            fVar128 = auVar54._0_4_ * auVar57._0_4_;
            auVar79._16_48_ = auVar119;
            auVar79._0_16_ = auVar55;
            auVar78._4_60_ = auVar79._4_60_;
            auVar78._0_4_ = fVar128;
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar78._0_16_,0);
            auVar81._16_48_ = in_ZMM17._16_48_;
            auVar54 = vxorps_avx512vl(auVar56,auVar163);
            auVar81._0_16_ = auVar56;
            auVar80._4_60_ = auVar81._4_60_;
            auVar80._0_4_ = fVar128 * auVar54._0_4_;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar80._0_16_,0);
          }
          else if (iVar36 == 4) {
            auVar54 = vbroadcastss_avx512vl(auVar54);
            auVar55 = vaddps_avx512vl(auVar55,auVar54);
            auVar54 = vrsqrtps_avx(auVar55);
            auVar143._0_4_ = auVar55._0_4_ * auVar54._0_4_;
            auVar143._4_4_ = auVar55._4_4_ * auVar54._4_4_;
            auVar143._8_4_ = auVar55._8_4_ * auVar54._8_4_;
            auVar143._12_4_ = auVar55._12_4_ * auVar54._12_4_;
            auVar55 = vfmadd213ps_fma(auVar143,auVar54,auVar166);
            auVar144._0_4_ = auVar54._0_4_ * -0.5 * auVar55._0_4_;
            auVar144._4_4_ = auVar54._4_4_ * -0.5 * auVar55._4_4_;
            auVar144._8_4_ = auVar54._8_4_ * -0.5 * auVar55._8_4_;
            auVar144._12_4_ = auVar54._12_4_ * -0.5 * auVar55._12_4_;
            auVar54 = vxorps_avx512vl(auVar56,auVar163);
            auVar160._0_4_ = auVar144._0_4_ * auVar54._0_4_;
            auVar160._4_4_ = auVar144._4_4_ * auVar54._4_4_;
            auVar160._8_4_ = auVar144._8_4_ * auVar54._8_4_;
            auVar160._12_4_ = auVar144._12_4_ * auVar54._12_4_;
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar144,0);
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar160,0);
          }
        }
        else if (iVar36 == 8) {
          auVar60 = vbroadcastss_avx512vl(auVar54);
          auVar61 = vaddps_avx512vl(in_ZMM17._0_32_,auVar60);
          auVar60 = vrsqrtps_avx(auVar61);
          auVar59._4_4_ = auVar61._4_4_ * auVar60._4_4_;
          auVar59._0_4_ = auVar61._0_4_ * auVar60._0_4_;
          auVar59._8_4_ = auVar61._8_4_ * auVar60._8_4_;
          auVar59._12_4_ = auVar61._12_4_ * auVar60._12_4_;
          auVar59._16_4_ = auVar61._16_4_ * auVar60._16_4_;
          auVar59._20_4_ = auVar61._20_4_ * auVar60._20_4_;
          auVar59._24_4_ = auVar61._24_4_ * auVar60._24_4_;
          auVar59._28_4_ = auVar61._28_4_;
          auVar54 = vfmadd213ps_fma(auVar59,auVar60,auVar65);
          auVar61._0_4_ = auVar60._0_4_ * -0.5 * auVar54._0_4_;
          auVar61._4_4_ = auVar60._4_4_ * -0.5 * auVar54._4_4_;
          auVar61._8_4_ = auVar60._8_4_ * -0.5 * auVar54._8_4_;
          auVar61._12_4_ = auVar60._12_4_ * -0.5 * auVar54._12_4_;
          auVar61._16_4_ = auVar60._16_4_ * -0.5 * 0.0;
          auVar61._20_4_ = auVar60._20_4_ * -0.5 * 0.0;
          auVar61._24_4_ = auVar60._24_4_ * -0.5 * 0.0;
          auVar61._28_4_ = 0;
          auVar59 = vxorps_avx512vl(in_ZMM16._0_32_,auVar64);
          auVar60._4_4_ = auVar61._4_4_ * auVar59._4_4_;
          auVar60._0_4_ = auVar61._0_4_ * auVar59._0_4_;
          auVar60._8_4_ = auVar61._8_4_ * auVar59._8_4_;
          auVar60._12_4_ = auVar61._12_4_ * auVar59._12_4_;
          auVar60._16_4_ = auVar61._16_4_ * auVar59._16_4_;
          auVar60._20_4_ = auVar61._20_4_ * auVar59._20_4_;
          auVar60._24_4_ = auVar61._24_4_ * auVar59._24_4_;
          auVar60._28_4_ = auVar59._28_4_;
          in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar61,0);
          in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar60,0);
        }
        else if (iVar36 == 0x10) {
          auVar173 = vbroadcastss_avx512f(auVar54);
          auVar173 = vaddps_avx512f(in_ZMM17,auVar173);
          auVar174 = vrsqrt14ps_avx512f(auVar173);
          auVar173 = vmulps_avx512f(auVar173,auVar174);
          auVar173 = vfmadd213ps_avx512f(auVar173,auVar174,auVar69);
          auVar174 = vmulps_avx512f(auVar174,auVar70);
          in_ZMM17 = vmulps_avx512f(auVar174,auVar173);
          auVar173 = vxorps_avx512dq(in_ZMM16,auVar71);
          in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar173);
        }
        auVar55 = in_ZMM17._0_16_;
        auVar60 = in_ZMM17._0_32_;
        auVar54 = in_ZMM16._0_16_;
        auVar59 = in_ZMM16._0_32_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
          auVar57 = auVar55;
          if (iVar36 != 4) {
            auVar57 = vbroadcastss_avx512vl(auVar55);
          }
          in_ZMM18 = ZEXT1664(auVar57);
          auVar56 = auVar54;
          if (iVar36 != 4) {
            auVar56 = vbroadcastss_avx512vl(auVar54);
          }
          in_ZMM19 = ZEXT1664(auVar56);
          if (iVar36 != 8) {
            auVar60 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
          }
          in_ZMM20 = ZEXT3264(auVar60);
          if (iVar36 != 8) {
            auVar59 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
          }
          auVar173 = in_ZMM16;
          auVar174 = in_ZMM17;
          if (iVar36 != 0x10) {
            auVar174 = vinsertf64x4_avx512f(in_ZMM20,auVar60,1);
            auVar173 = vinsertf64x4_avx512f(ZEXT3264(auVar59),auVar59,1);
          }
          uVar51 = 0;
          if (0xf < (int)uVar44) {
            iVar38 = 0x10;
            do {
              auVar72 = vfmadd132ps_avx512f(*pauVar49,auVar173,auVar174);
              *pauVar49 = auVar72;
              pauVar49 = pauVar49 + 1;
              iVar38 = iVar38 + 0x10;
              uVar51 = uVar47;
            } while (iVar38 <= (int)uVar44);
          }
          uVar39 = uVar51 | 8;
          while ((int)uVar39 <= (int)uVar44) {
            auVar61 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar59,auVar60);
            *(undefined1 (*) [32])*pauVar49 = auVar61;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
            uVar39 = uVar51 + 0x10;
            uVar51 = uVar51 + 8;
          }
          iVar38 = uVar51 + 4;
          while (iVar38 <= (int)uVar44) {
            auVar58 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar56,auVar57);
            *(undefined1 (*) [16])*pauVar49 = auVar58;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
            iVar38 = uVar51 + 8;
            uVar51 = uVar51 + 4;
          }
          if ((int)uVar51 < (int)uVar44) {
            auVar173 = vpbroadcastq_avx512f();
            in_ZMM17 = vbroadcastss_avx512f(auVar55);
            in_ZMM16 = vbroadcastss_avx512f(auVar54);
            uVar42 = 0;
            do {
              auVar174 = vpbroadcastq_avx512f();
              in_ZMM18 = vporq_avx512f(auVar174,auVar67);
              auVar174 = vporq_avx512f(auVar174,auVar68);
              uVar20 = vpcmpuq_avx512f(auVar174,auVar173,2);
              bVar30 = (byte)uVar20;
              uVar20 = vpcmpuq_avx512f(in_ZMM18,auVar173,2);
              bVar31 = (byte)uVar20;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar49 + uVar42 * 4);
              auVar84._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar84._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar84._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar84._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar84._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar84._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar84._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar84._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar84._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar84._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar84._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar84._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar84._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar84._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar84._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar84._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar72 = vfmadd213ps_avx512f(auVar84,in_ZMM17,in_ZMM16);
              auVar174 = *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4);
              auVar85._0_4_ =
                   (uint)(bVar30 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar174._0_4_;
              bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
              auVar85._4_4_ = (uint)bVar7 * auVar72._4_4_ | (uint)!bVar7 * auVar174._4_4_;
              bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
              auVar85._8_4_ = (uint)bVar7 * auVar72._8_4_ | (uint)!bVar7 * auVar174._8_4_;
              bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
              auVar85._12_4_ = (uint)bVar7 * auVar72._12_4_ | (uint)!bVar7 * auVar174._12_4_;
              bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
              auVar85._16_4_ = (uint)bVar7 * auVar72._16_4_ | (uint)!bVar7 * auVar174._16_4_;
              bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
              auVar85._20_4_ = (uint)bVar7 * auVar72._20_4_ | (uint)!bVar7 * auVar174._20_4_;
              bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
              auVar85._24_4_ = (uint)bVar7 * auVar72._24_4_ | (uint)!bVar7 * auVar174._24_4_;
              bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
              auVar85._28_4_ = (uint)bVar7 * auVar72._28_4_ | (uint)!bVar7 * auVar174._28_4_;
              auVar85._32_4_ =
                   (uint)(bVar31 & 1) * auVar72._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar174._32_4_
              ;
              bVar7 = (bool)(bVar31 >> 1 & 1);
              auVar85._36_4_ = (uint)bVar7 * auVar72._36_4_ | (uint)!bVar7 * auVar174._36_4_;
              bVar7 = (bool)(bVar31 >> 2 & 1);
              auVar85._40_4_ = (uint)bVar7 * auVar72._40_4_ | (uint)!bVar7 * auVar174._40_4_;
              bVar7 = (bool)(bVar31 >> 3 & 1);
              auVar85._44_4_ = (uint)bVar7 * auVar72._44_4_ | (uint)!bVar7 * auVar174._44_4_;
              bVar7 = (bool)(bVar31 >> 4 & 1);
              auVar85._48_4_ = (uint)bVar7 * auVar72._48_4_ | (uint)!bVar7 * auVar174._48_4_;
              bVar7 = (bool)(bVar31 >> 5 & 1);
              auVar85._52_4_ = (uint)bVar7 * auVar72._52_4_ | (uint)!bVar7 * auVar174._52_4_;
              bVar7 = (bool)(bVar31 >> 6 & 1);
              auVar85._56_4_ = (uint)bVar7 * auVar72._56_4_ | (uint)!bVar7 * auVar174._56_4_;
              auVar85._60_4_ =
                   (uint)(bVar31 >> 7) * auVar72._60_4_ |
                   (uint)!(bool)(bVar31 >> 7) * auVar174._60_4_;
              *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4) = auVar85;
              uVar42 = uVar42 + 0x10;
            } while (((ulong)(~uVar51 + uVar44) + 0x10 & 0x1fffffff0) != uVar42);
          }
        }
        else {
          pauVar37 = pauVar50;
          pauVar41 = pauVar43;
          if (0xf < (int)uVar44 && iVar36 == 0x10) {
            iVar38 = 0x10;
            do {
              auVar173 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar41));
              auVar174 = vfmadd132ps_avx512f(*pauVar49,in_ZMM16,in_ZMM17);
              uVar3 = *(undefined4 *)*pauVar37;
              auVar29._4_4_ = uVar3;
              auVar29._0_4_ = uVar3;
              auVar29._8_4_ = uVar3;
              auVar29._12_4_ = uVar3;
              auVar29._16_4_ = uVar3;
              auVar29._20_4_ = uVar3;
              auVar29._24_4_ = uVar3;
              auVar29._28_4_ = uVar3;
              auVar29._32_4_ = uVar3;
              auVar29._36_4_ = uVar3;
              auVar29._40_4_ = uVar3;
              auVar29._44_4_ = uVar3;
              auVar29._48_4_ = uVar3;
              auVar29._52_4_ = uVar3;
              auVar29._56_4_ = uVar3;
              auVar29._60_4_ = uVar3;
              auVar173 = vfmadd213ps_avx512f(auVar174,auVar173,auVar29);
              *pauVar49 = auVar173;
              pauVar49 = pauVar49 + 1;
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              iVar38 = iVar38 + 0x10;
            } while (iVar38 <= (int)uVar44);
          }
          if (iVar36 == 8) {
            uVar51 = 8;
            if (0xf < (int)uVar44) {
              auVar173 = vinsertf64x4_avx512f(in_ZMM17,auVar60,1);
              in_ZMM18 = vinsertf64x4_avx512f(in_ZMM16,auVar59,1);
              iVar38 = 0x10;
              do {
                auVar174 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar41),auVar122,
                                             ZEXT464(*(uint *)(*pauVar41 + 4)));
                in_ZMM20 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar122,
                                             ZEXT464(*(uint *)(*pauVar37 + 4)));
                auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar173);
                in_ZMM19 = vfmadd213ps_avx512f(auVar72,auVar174,in_ZMM20);
                *pauVar49 = in_ZMM19;
                pauVar49 = pauVar49 + 1;
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                iVar38 = iVar38 + 0x10;
                uVar51 = uVar44 | 8;
              } while (iVar38 <= (int)uVar44);
            }
            for (; (int)uVar51 <= (int)uVar44; uVar51 = uVar51 + 8) {
              uVar3 = *(undefined4 *)*pauVar41;
              auVar63._4_4_ = uVar3;
              auVar63._0_4_ = uVar3;
              auVar63._8_4_ = uVar3;
              auVar63._12_4_ = uVar3;
              auVar63._16_4_ = uVar3;
              auVar63._20_4_ = uVar3;
              auVar63._24_4_ = uVar3;
              auVar63._28_4_ = uVar3;
              auVar61 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar59,auVar60);
              uVar3 = *(undefined4 *)*pauVar37;
              auVar62._4_4_ = uVar3;
              auVar62._0_4_ = uVar3;
              auVar62._8_4_ = uVar3;
              auVar62._12_4_ = uVar3;
              auVar62._16_4_ = uVar3;
              auVar62._20_4_ = uVar3;
              auVar62._24_4_ = uVar3;
              auVar62._28_4_ = uVar3;
              auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar62);
              *(undefined1 (*) [32])*pauVar49 = auVar61;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          if (iVar36 == 4) {
            uVar51 = 0;
            if (0xf < (int)uVar44) {
              auVar173 = vinsertf64x4_avx512f(in_ZMM17,auVar60,1);
              auVar173 = vpermpd_avx512f(auVar173,0x44);
              auVar174 = vinsertf64x4_avx512f(in_ZMM16,auVar59,1);
              in_ZMM18 = vpermpd_avx512f(auVar174,0x44);
              iVar38 = 0x10;
              do {
                auVar174 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 8)));
                auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 0xc)));
                auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                           ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                auVar61 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                auVar174 = vinsertf64x4_avx512f(auVar174,auVar61,0);
                auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                auVar83._0_48_ = auVar174._0_48_;
                auVar83._48_8_ = auVar72._48_8_;
                auVar83._56_8_ = auVar72._56_8_;
                auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                           ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                auVar61 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                auVar174 = vinsertf64x4_avx512f(auVar73,auVar61,0);
                in_ZMM19._0_48_ = auVar174._0_48_;
                in_ZMM19._48_8_ = auVar82._48_8_;
                in_ZMM19._56_8_ = auVar82._56_8_;
                auVar174 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar173);
                in_ZMM20 = vfmadd213ps_avx512f(auVar174,auVar83,in_ZMM19);
                *pauVar49 = in_ZMM20;
                pauVar49 = pauVar49 + 1;
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                iVar38 = iVar38 + 0x10;
                uVar51 = uVar47;
              } while (iVar38 <= (int)uVar44);
            }
            if ((int)(uVar51 | 8) <= (int)uVar44) {
              auVar60 = vpermpd_avx512vl(auVar60,0x44);
              auVar59 = vpermpd_avx512vl(auVar59,0x44);
              in_ZMM18 = ZEXT3264(auVar59);
              uVar39 = uVar51;
              do {
                auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                           ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                auVar56 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                           ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                auVar61 = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                auVar62 = vpermpd_avx512vl(ZEXT1632(auVar56),0x50);
                in_ZMM19 = ZEXT3264(auVar62);
                auVar63 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar59,auVar60);
                auVar61 = vfmadd213ps_avx512vl(auVar63,auVar61,auVar62);
                in_ZMM20 = ZEXT3264(auVar61);
                *(undefined1 (*) [32])*pauVar49 = auVar61;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                uVar51 = uVar39 + 8;
                iVar38 = uVar39 + 0x10;
                uVar39 = uVar51;
              } while (iVar38 <= (int)uVar44);
            }
            while (uVar51 = uVar51 + 4, (int)uVar51 <= (int)uVar44) {
              uVar3 = *(undefined4 *)*pauVar41;
              auVar145._4_4_ = uVar3;
              auVar145._0_4_ = uVar3;
              auVar145._8_4_ = uVar3;
              auVar145._12_4_ = uVar3;
              auVar57 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar54,auVar55);
              uVar3 = *(undefined4 *)*pauVar37;
              auVar23._4_4_ = uVar3;
              auVar23._0_4_ = uVar3;
              auVar23._8_4_ = uVar3;
              auVar23._12_4_ = uVar3;
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar145,auVar23);
              *(undefined1 (*) [16])*pauVar49 = auVar57;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          if (iVar36 == 1) {
            in_ZMM18 = vbroadcastss_avx512f(auVar55);
            in_ZMM19 = vbroadcastss_avx512f(auVar54);
            uVar51 = 0;
            if (0xf < (int)uVar44) {
              iVar38 = 0x10;
              do {
                auVar173 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,in_ZMM18);
                auVar173 = vfmadd213ps_avx512f(auVar173,*pauVar41,*pauVar37);
                *pauVar49 = auVar173;
                pauVar49 = pauVar49 + 1;
                pauVar41 = pauVar41 + 1;
                pauVar37 = pauVar37 + 1;
                iVar38 = iVar38 + 0x10;
                uVar51 = uVar47;
              } while (iVar38 <= (int)uVar44);
            }
            uVar39 = uVar51 | 8;
            while ((int)uVar39 <= (int)uVar44) {
              auVar60 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])*pauVar49,in_ZMM19._0_32_,in_ZMM18._0_32_);
              auVar57 = vfmadd213ps_fma(auVar60,*(undefined1 (*) [32])*pauVar41,
                                        *(undefined1 (*) [32])*pauVar37);
              *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar57);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
              uVar39 = uVar51 + 0x10;
              uVar51 = uVar51 + 8;
            }
            iVar38 = uVar51 + 4;
            while (iVar38 <= (int)uVar44) {
              auVar57 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])*pauVar49,in_ZMM19._0_16_,in_ZMM18._0_16_);
              auVar57 = vfmadd213ps_fma(auVar57,*(undefined1 (*) [16])*pauVar41,
                                        *(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar49 = auVar57;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
              iVar38 = uVar51 + 8;
              uVar51 = uVar51 + 4;
            }
            if (uVar44 - uVar51 != 0 && (int)uVar51 <= (int)uVar44) {
              lVar52 = 0;
              do {
                auVar57 = vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),auVar54,
                                              auVar55);
                auVar57 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar41 + lVar52 * 4)),auVar57,
                                          ZEXT416(*(uint *)(*pauVar37 + lVar52 * 4)));
                *(int *)(*pauVar49 + lVar52 * 4) = auVar57._0_4_;
                lVar52 = lVar52 + 1;
              } while (uVar44 - uVar51 != (int)lVar52);
            }
          }
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != uVar45);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}